

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersectorK<8,8>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [28];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  uint uVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  long lVar19;
  long lVar20;
  RTCFilterFunctionN p_Var21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ulong uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [28];
  undefined1 auVar103 [32];
  int iVar104;
  ulong uVar105;
  RTCIntersectArguments *pRVar106;
  ulong uVar107;
  ulong uVar108;
  uint uVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  undefined4 uVar113;
  undefined8 unaff_R13;
  Geometry *geometry;
  undefined1 auVar116 [16];
  undefined8 uVar114;
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined8 uVar115;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar130;
  float fVar132;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar136 [16];
  undefined1 auVar138 [32];
  undefined1 auVar137 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar150 [16];
  float fVar147;
  float fVar148;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar149;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  float fVar190;
  float fVar195;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar208 [16];
  undefined4 uVar207;
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  float fVar220;
  float fVar223;
  undefined8 uVar224;
  undefined8 uVar225;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined8 uVar226;
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  RTCFilterFunctionNArguments args;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  LinearSpace3fa *local_630;
  Primitive *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined4 uStack_484;
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  int local_300;
  int local_2fc;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_280 [4];
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar211 [32];
  
  PVar15 = prim[1];
  uVar105 = (ulong)(byte)PVar15;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar105 * 4 + 6);
  auVar199 = vpmovsxbd_avx2(auVar6);
  lVar112 = uVar105 * 0x25;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar105 * 5 + 6);
  auVar118 = vpmovsxbd_avx2(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar105 * 6 + 6);
  auVar24 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar105 * 0xf + 6);
  auVar117 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar15 * 0x10 + 6);
  auVar126 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar105 * 0x11 + 6);
  auVar144 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar105 * 0x1a + 6);
  auVar119 = vpmovsxbd_avx2(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar105 * 0x1b + 6);
  auVar129 = vpmovsxbd_avx2(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar105 * 0x1c + 6);
  auVar128 = vpmovsxbd_avx2(auVar14);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  fVar190 = *(float *)(prim + lVar112 + 0x12);
  auVar8 = vsubps_avx(auVar6,*(undefined1 (*) [16])(prim + lVar112 + 6));
  fVar149 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar112 + 0x16)) *
            *(float *)(prim + lVar112 + 0x1a);
  auVar6 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar180._0_4_ = fVar190 * auVar8._0_4_;
  auVar180._4_4_ = fVar190 * auVar8._4_4_;
  auVar180._8_4_ = fVar190 * auVar8._8_4_;
  auVar180._12_4_ = fVar190 * auVar8._12_4_;
  auVar228._0_4_ = fVar190 * auVar6._0_4_;
  auVar228._4_4_ = fVar190 * auVar6._4_4_;
  auVar228._8_4_ = fVar190 * auVar6._8_4_;
  auVar228._12_4_ = fVar190 * auVar6._12_4_;
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar22 = vcvtdq2ps_avx(auVar128);
  auVar6 = vmovshdup_avx(auVar228);
  auVar172._0_8_ = auVar6._0_8_;
  auVar172._8_8_ = auVar172._0_8_;
  auVar172._16_8_ = auVar172._0_8_;
  auVar172._24_8_ = auVar172._0_8_;
  auVar6 = vshufps_avx(auVar228,auVar228,0xaa);
  fVar190 = auVar6._0_4_;
  auVar203._0_4_ = fVar190 * auVar24._0_4_;
  fVar195 = auVar6._4_4_;
  auVar203._4_4_ = fVar195 * auVar24._4_4_;
  auVar203._8_4_ = fVar190 * auVar24._8_4_;
  auVar203._12_4_ = fVar195 * auVar24._12_4_;
  auVar203._16_4_ = fVar190 * auVar24._16_4_;
  auVar203._20_4_ = fVar195 * auVar24._20_4_;
  auVar203._24_4_ = fVar190 * auVar24._24_4_;
  auVar203._28_4_ = 0;
  auVar25._4_4_ = fVar195 * auVar144._4_4_;
  auVar25._0_4_ = fVar190 * auVar144._0_4_;
  auVar25._8_4_ = fVar190 * auVar144._8_4_;
  auVar25._12_4_ = fVar195 * auVar144._12_4_;
  auVar25._16_4_ = fVar190 * auVar144._16_4_;
  auVar25._20_4_ = fVar195 * auVar144._20_4_;
  auVar25._24_4_ = fVar190 * auVar144._24_4_;
  auVar25._28_4_ = auVar128._28_4_;
  auVar128._4_4_ = auVar22._4_4_ * fVar195;
  auVar128._0_4_ = auVar22._0_4_ * fVar190;
  auVar128._8_4_ = auVar22._8_4_ * fVar190;
  auVar128._12_4_ = auVar22._12_4_ * fVar195;
  auVar128._16_4_ = auVar22._16_4_ * fVar190;
  auVar128._20_4_ = auVar22._20_4_ * fVar195;
  auVar128._24_4_ = auVar22._24_4_ * fVar190;
  auVar128._28_4_ = fVar195;
  auVar7 = vfmadd231ps_fma(auVar203,auVar172,auVar118);
  auVar8 = vfmadd231ps_fma(auVar25,auVar172,auVar126);
  auVar9 = vfmadd231ps_fma(auVar128,auVar129,auVar172);
  auVar6 = vshufps_avx(auVar180,auVar180,0xaa);
  fVar190 = auVar6._0_4_;
  auVar173._0_4_ = fVar190 * auVar24._0_4_;
  fVar195 = auVar6._4_4_;
  auVar173._4_4_ = fVar195 * auVar24._4_4_;
  auVar173._8_4_ = fVar190 * auVar24._8_4_;
  auVar173._12_4_ = fVar195 * auVar24._12_4_;
  auVar173._16_4_ = fVar190 * auVar24._16_4_;
  auVar173._20_4_ = fVar195 * auVar24._20_4_;
  auVar173._24_4_ = fVar190 * auVar24._24_4_;
  auVar173._28_4_ = 0;
  auVar214._4_4_ = fVar195 * auVar144._4_4_;
  auVar214._0_4_ = fVar190 * auVar144._0_4_;
  auVar214._8_4_ = fVar190 * auVar144._8_4_;
  auVar214._12_4_ = fVar195 * auVar144._12_4_;
  auVar214._16_4_ = fVar190 * auVar144._16_4_;
  auVar214._20_4_ = fVar195 * auVar144._20_4_;
  auVar214._24_4_ = fVar190 * auVar144._24_4_;
  auVar214._28_4_ = auVar144._28_4_;
  auVar23._4_4_ = fVar195 * auVar22._4_4_;
  auVar23._0_4_ = fVar190 * auVar22._0_4_;
  auVar23._8_4_ = fVar190 * auVar22._8_4_;
  auVar23._12_4_ = fVar195 * auVar22._12_4_;
  auVar23._16_4_ = fVar190 * auVar22._16_4_;
  auVar23._20_4_ = fVar195 * auVar22._20_4_;
  auVar23._24_4_ = fVar190 * auVar22._24_4_;
  auVar23._28_4_ = auVar24._28_4_;
  auVar6 = vmovshdup_avx(auVar180);
  auVar221._0_8_ = auVar6._0_8_;
  auVar221._8_8_ = auVar221._0_8_;
  auVar221._16_8_ = auVar221._0_8_;
  auVar221._24_8_ = auVar221._0_8_;
  auVar6 = vfmadd231ps_fma(auVar173,auVar221,auVar118);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 7 + 6));
  auVar10 = vfmadd231ps_fma(auVar214,auVar221,auVar126);
  auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0xb + 6));
  auVar11 = vfmadd231ps_fma(auVar23,auVar221,auVar129);
  auVar128 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 9 + 6));
  auVar25 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0xd + 6));
  auVar118 = vcvtdq2ps_avx(auVar199);
  auVar24 = vcvtdq2ps_avx(auVar117);
  auVar126 = vcvtdq2ps_avx(auVar119);
  auVar209._4_4_ = auVar228._0_4_;
  auVar209._0_4_ = auVar228._0_4_;
  auVar209._8_4_ = auVar228._0_4_;
  auVar209._12_4_ = auVar228._0_4_;
  auVar209._16_4_ = auVar228._0_4_;
  auVar209._20_4_ = auVar228._0_4_;
  auVar209._24_4_ = auVar228._0_4_;
  auVar209._28_4_ = auVar228._0_4_;
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar209,auVar118);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar209,auVar24);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar126,auVar209);
  auVar210 = ZEXT464(CONCAT31(0,PVar15));
  auVar183._4_4_ = auVar180._0_4_;
  auVar183._0_4_ = auVar180._0_4_;
  auVar183._8_4_ = auVar180._0_4_;
  auVar183._12_4_ = auVar180._0_4_;
  auVar183._16_4_ = auVar180._0_4_;
  auVar183._20_4_ = auVar180._0_4_;
  auVar183._24_4_ = auVar180._0_4_;
  auVar183._28_4_ = auVar180._0_4_;
  auVar180 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar183,auVar118);
  auVar228 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar183,auVar24);
  auVar116 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar183,auVar126);
  local_3c0._8_4_ = 0x7fffffff;
  local_3c0._0_8_ = 0x7fffffff7fffffff;
  local_3c0._12_4_ = 0x7fffffff;
  local_3c0._16_4_ = 0x7fffffff;
  local_3c0._20_4_ = 0x7fffffff;
  local_3c0._24_4_ = 0x7fffffff;
  local_3c0._28_4_ = 0x7fffffff;
  auVar117._8_4_ = 0x219392ef;
  auVar117._0_8_ = 0x219392ef219392ef;
  auVar117._12_4_ = 0x219392ef;
  auVar117._16_4_ = 0x219392ef;
  auVar117._20_4_ = 0x219392ef;
  auVar117._24_4_ = 0x219392ef;
  auVar117._28_4_ = 0x219392ef;
  auVar118 = vandps_avx(ZEXT1632(auVar7),local_3c0);
  auVar118 = vcmpps_avx(auVar118,auVar117,1);
  auVar24 = vblendvps_avx(ZEXT1632(auVar7),auVar117,auVar118);
  auVar118 = vandps_avx(ZEXT1632(auVar8),local_3c0);
  auVar118 = vcmpps_avx(auVar118,auVar117,1);
  auVar126 = vblendvps_avx(ZEXT1632(auVar8),auVar117,auVar118);
  auVar118 = vandps_avx(ZEXT1632(auVar9),local_3c0);
  auVar118 = vcmpps_avx(auVar118,auVar117,1);
  auVar118 = vblendvps_avx(ZEXT1632(auVar9),auVar117,auVar118);
  auVar196._4_4_ = fVar149;
  auVar196._0_4_ = fVar149;
  auVar196._8_4_ = fVar149;
  auVar196._12_4_ = fVar149;
  auVar196._16_4_ = fVar149;
  auVar196._20_4_ = fVar149;
  auVar196._24_4_ = fVar149;
  auVar196._28_4_ = fVar149;
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar129 = vcvtdq2ps_avx(auVar22);
  auVar129 = vsubps_avx(auVar129,auVar144);
  auVar9 = vfmadd213ps_fma(auVar129,auVar196,auVar144);
  auVar144 = vcvtdq2ps_avx(auVar128);
  auVar129 = vcvtdq2ps_avx(auVar25);
  auVar129 = vsubps_avx(auVar129,auVar144);
  auVar10 = vfmadd213ps_fma(auVar129,auVar196,auVar144);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x12 + 6));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar129 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x16 + 6));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar144);
  auVar11 = vfmadd213ps_fma(auVar129,auVar196,auVar144);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x14 + 6));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar129 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x18 + 6));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar144);
  auVar12 = vfmadd213ps_fma(auVar129,auVar196,auVar144);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x1d + 6));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar129 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x21 + 6));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar144);
  auVar13 = vfmadd213ps_fma(auVar129,auVar196,auVar144);
  auVar144 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x1f + 6));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar129 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 * 0x23 + 6));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar144);
  auVar14 = vfmadd213ps_fma(auVar129,auVar196,auVar144);
  auVar144 = vrcpps_avx(auVar24);
  auVar211._8_4_ = 0x3f800000;
  auVar211._0_8_ = 0x3f8000003f800000;
  auVar211._12_4_ = 0x3f800000;
  auVar211._16_4_ = 0x3f800000;
  auVar211._20_4_ = 0x3f800000;
  auVar211._24_4_ = 0x3f800000;
  auVar211._28_4_ = 0x3f800000;
  auVar215 = ZEXT3264(auVar211);
  auVar6 = vfnmadd213ps_fma(auVar24,auVar144,auVar211);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar144,auVar144);
  auVar24 = vrcpps_avx(auVar126);
  auVar7 = vfnmadd213ps_fma(auVar126,auVar24,auVar211);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar24,auVar24);
  auVar24 = vrcpps_avx(auVar118);
  auVar8 = vfnmadd213ps_fma(auVar118,auVar24,auVar211);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar24,auVar24);
  auVar118 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar180));
  auVar126._4_4_ = auVar6._4_4_ * auVar118._4_4_;
  auVar126._0_4_ = auVar6._0_4_ * auVar118._0_4_;
  auVar126._8_4_ = auVar6._8_4_ * auVar118._8_4_;
  auVar126._12_4_ = auVar6._12_4_ * auVar118._12_4_;
  auVar126._16_4_ = auVar118._16_4_ * 0.0;
  auVar126._20_4_ = auVar118._20_4_ * 0.0;
  auVar126._24_4_ = auVar118._24_4_ * 0.0;
  auVar126._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar180));
  auVar144._4_4_ = auVar6._4_4_ * auVar118._4_4_;
  auVar144._0_4_ = auVar6._0_4_ * auVar118._0_4_;
  auVar144._8_4_ = auVar6._8_4_ * auVar118._8_4_;
  auVar144._12_4_ = auVar6._12_4_ * auVar118._12_4_;
  auVar144._16_4_ = auVar118._16_4_ * 0.0;
  auVar144._20_4_ = auVar118._20_4_ * 0.0;
  auVar144._24_4_ = auVar118._24_4_ * 0.0;
  auVar144._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar228));
  auVar129._4_4_ = auVar7._4_4_ * auVar118._4_4_;
  auVar129._0_4_ = auVar7._0_4_ * auVar118._0_4_;
  auVar129._8_4_ = auVar7._8_4_ * auVar118._8_4_;
  auVar129._12_4_ = auVar7._12_4_ * auVar118._12_4_;
  auVar129._16_4_ = auVar118._16_4_ * 0.0;
  auVar129._20_4_ = auVar118._20_4_ * 0.0;
  auVar129._24_4_ = auVar118._24_4_ * 0.0;
  auVar129._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar228));
  auVar22._4_4_ = auVar7._4_4_ * auVar118._4_4_;
  auVar22._0_4_ = auVar7._0_4_ * auVar118._0_4_;
  auVar22._8_4_ = auVar7._8_4_ * auVar118._8_4_;
  auVar22._12_4_ = auVar7._12_4_ * auVar118._12_4_;
  auVar22._16_4_ = auVar118._16_4_ * 0.0;
  auVar22._20_4_ = auVar118._20_4_ * 0.0;
  auVar22._24_4_ = auVar118._24_4_ * 0.0;
  auVar22._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar116));
  auVar199._4_4_ = auVar8._4_4_ * auVar118._4_4_;
  auVar199._0_4_ = auVar8._0_4_ * auVar118._0_4_;
  auVar199._8_4_ = auVar8._8_4_ * auVar118._8_4_;
  auVar199._12_4_ = auVar8._12_4_ * auVar118._12_4_;
  auVar199._16_4_ = auVar118._16_4_ * 0.0;
  auVar199._20_4_ = auVar118._20_4_ * 0.0;
  auVar199._24_4_ = auVar118._24_4_ * 0.0;
  auVar199._28_4_ = auVar118._28_4_;
  auVar118 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar116));
  auVar119._0_4_ = auVar8._0_4_ * auVar118._0_4_;
  auVar119._4_4_ = auVar8._4_4_ * auVar118._4_4_;
  auVar119._8_4_ = auVar8._8_4_ * auVar118._8_4_;
  auVar119._12_4_ = auVar8._12_4_ * auVar118._12_4_;
  auVar119._16_4_ = auVar118._16_4_ * 0.0;
  auVar119._20_4_ = auVar118._20_4_ * 0.0;
  auVar119._24_4_ = auVar118._24_4_ * 0.0;
  auVar119._28_4_ = 0;
  auVar118 = vpminsd_avx2(auVar126,auVar144);
  auVar24 = vpminsd_avx2(auVar129,auVar22);
  auVar118 = vmaxps_avx(auVar118,auVar24);
  auVar24 = vpminsd_avx2(auVar199,auVar119);
  uVar113 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar197._4_4_ = uVar113;
  auVar197._0_4_ = uVar113;
  auVar197._8_4_ = uVar113;
  auVar197._12_4_ = uVar113;
  auVar197._16_4_ = uVar113;
  auVar197._20_4_ = uVar113;
  auVar197._24_4_ = uVar113;
  auVar197._28_4_ = uVar113;
  auVar24 = vmaxps_avx(auVar24,auVar197);
  auVar118 = vmaxps_avx(auVar118,auVar24);
  local_80._4_4_ = auVar118._4_4_ * 0.99999964;
  local_80._0_4_ = auVar118._0_4_ * 0.99999964;
  local_80._8_4_ = auVar118._8_4_ * 0.99999964;
  local_80._12_4_ = auVar118._12_4_ * 0.99999964;
  local_80._16_4_ = auVar118._16_4_ * 0.99999964;
  local_80._20_4_ = auVar118._20_4_ * 0.99999964;
  local_80._24_4_ = auVar118._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar118 = vpmaxsd_avx2(auVar126,auVar144);
  auVar24 = vpmaxsd_avx2(auVar129,auVar22);
  auVar118 = vminps_avx(auVar118,auVar24);
  auVar24 = vpmaxsd_avx2(auVar199,auVar119);
  uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar156._4_4_ = uVar113;
  auVar156._0_4_ = uVar113;
  auVar156._8_4_ = uVar113;
  auVar156._12_4_ = uVar113;
  auVar156._16_4_ = uVar113;
  auVar156._20_4_ = uVar113;
  auVar156._24_4_ = uVar113;
  auVar156._28_4_ = uVar113;
  auVar24 = vminps_avx(auVar24,auVar156);
  auVar118 = vminps_avx(auVar118,auVar24);
  auVar24._4_4_ = auVar118._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar118._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar118._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar118._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar118._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar118._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar118._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar118._28_4_;
  auVar138[4] = PVar15;
  auVar138._0_4_ = CONCAT31(0,PVar15);
  auVar138._5_3_ = 0;
  auVar138[8] = PVar15;
  auVar138._9_3_ = 0;
  auVar138[0xc] = PVar15;
  auVar138._13_3_ = 0;
  auVar138[0x10] = PVar15;
  auVar138._17_3_ = 0;
  auVar138[0x14] = PVar15;
  auVar138._21_3_ = 0;
  auVar138[0x18] = PVar15;
  auVar138._25_3_ = 0;
  auVar138[0x1c] = PVar15;
  auVar138._29_3_ = 0;
  auVar118 = vcmpps_avx(local_80,auVar24,2);
  auVar24 = vpcmpgtd_avx2(auVar138,_DAT_01fb4ba0);
  auVar118 = vandps_avx(auVar118,auVar24);
  uVar113 = vmovmskps_avx(auVar118);
  uVar105 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar113);
  local_630 = pre->ray_space + k;
  local_620 = mm_lookupmask_ps._16_8_;
  uStack_618 = mm_lookupmask_ps._24_8_;
  uStack_610 = mm_lookupmask_ps._16_8_;
  uStack_608 = mm_lookupmask_ps._24_8_;
  iVar104 = 1 << ((uint)k & 0x1f);
  auVar118._4_4_ = iVar104;
  auVar118._0_4_ = iVar104;
  auVar118._8_4_ = iVar104;
  auVar118._12_4_ = iVar104;
  auVar118._16_4_ = iVar104;
  auVar118._20_4_ = iVar104;
  auVar118._24_4_ = iVar104;
  auVar118._28_4_ = iVar104;
  auVar24 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar118 = vpand_avx2(auVar118,auVar24);
  local_3e0 = vpcmpeqd_avx2(auVar118,auVar24);
  local_628 = prim;
  for (; uVar105 != 0; uVar105 = (ulong)((uint)uVar105 & (uint)uVar105 + 0xff & uVar109)) {
    lVar112 = 0;
    for (uVar108 = uVar105; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x8000000000000000) {
      lVar112 = lVar112 + 1;
    }
    uVar16 = *(uint *)(local_628 + 2);
    local_5e0._4_4_ = *(undefined4 *)(local_628 + lVar112 * 4 + 6);
    pGVar17 = (context->scene->geometries).items[uVar16].ptr;
    uVar108 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                              (ulong)(uint)local_5e0._4_4_ *
                              pGVar17[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar190 = (pGVar17->time_range).lower;
    fVar190 = pGVar17->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar190) / ((pGVar17->time_range).upper - fVar190))
    ;
    auVar6 = vroundss_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),9);
    auVar6 = vminss_avx(auVar6,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
    auVar6 = vmaxss_avx(ZEXT816(0) << 0x20,auVar6);
    fVar190 = fVar190 - auVar6._0_4_;
    fVar149 = 1.0 - fVar190;
    _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar110 = (long)(int)auVar6._0_4_ * 0x38;
    lVar111 = *(long *)(_Var18 + 0x10 + lVar110);
    lVar19 = *(long *)(_Var18 + 0x38 + lVar110);
    lVar20 = *(long *)(_Var18 + 0x48 + lVar110);
    pfVar1 = (float *)(lVar19 + lVar20 * uVar108);
    auVar150._0_4_ = fVar190 * *pfVar1;
    auVar150._4_4_ = fVar190 * pfVar1[1];
    auVar150._8_4_ = fVar190 * pfVar1[2];
    auVar150._12_4_ = fVar190 * pfVar1[3];
    lVar112 = uVar108 + 1;
    pfVar1 = (float *)(lVar19 + lVar20 * lVar112);
    auVar164._0_4_ = fVar190 * *pfVar1;
    auVar164._4_4_ = fVar190 * pfVar1[1];
    auVar164._8_4_ = fVar190 * pfVar1[2];
    auVar164._12_4_ = fVar190 * pfVar1[3];
    p_Var21 = pGVar17[4].occlusionFilterN;
    auVar116._4_4_ = fVar149;
    auVar116._0_4_ = fVar149;
    auVar116._8_4_ = fVar149;
    auVar116._12_4_ = fVar149;
    auVar11 = vfmadd231ps_fma(auVar150,auVar116,
                              *(undefined1 (*) [16])
                               (*(long *)(_Var18 + lVar110) + lVar111 * uVar108));
    _local_640 = vfmadd231ps_fma(auVar164,auVar116,
                                 *(undefined1 (*) [16])
                                  (*(long *)(_Var18 + lVar110) + lVar111 * lVar112));
    pfVar1 = (float *)(*(long *)(p_Var21 + lVar110 + 0x38) +
                      uVar108 * *(long *)(p_Var21 + lVar110 + 0x48));
    auVar165._0_4_ = fVar190 * *pfVar1;
    auVar165._4_4_ = fVar190 * pfVar1[1];
    auVar165._8_4_ = fVar190 * pfVar1[2];
    auVar165._12_4_ = fVar190 * pfVar1[3];
    pfVar1 = (float *)(*(long *)(p_Var21 + lVar110 + 0x38) +
                      *(long *)(p_Var21 + lVar110 + 0x48) * lVar112);
    auVar229._0_4_ = fVar190 * *pfVar1;
    auVar229._4_4_ = fVar190 * pfVar1[1];
    auVar229._8_4_ = fVar190 * pfVar1[2];
    auVar229._12_4_ = fVar190 * pfVar1[3];
    lVar112 = *(long *)(p_Var21 + lVar110 + 0x10) * lVar112;
    auVar7 = vfmadd231ps_fma(auVar165,auVar116,
                             *(undefined1 (*) [16])
                              (*(long *)(p_Var21 + lVar110) +
                              *(long *)(p_Var21 + lVar110 + 0x10) * uVar108));
    auVar8 = vfmadd231ps_fma(auVar229,auVar116,
                             *(undefined1 (*) [16])(*(long *)(p_Var21 + lVar110) + lVar112));
    auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
    iVar104 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar9 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar136._8_4_ = 0xbeaaaaab;
    auVar136._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar136._12_4_ = 0xbeaaaaab;
    auVar228 = vfnmadd213ps_fma(auVar7,auVar136,auVar11);
    local_6f0 = vfmadd213ps_fma(auVar8,auVar136,_local_640);
    auVar7 = vsubps_avx(auVar11,auVar9);
    uVar113 = auVar7._0_4_;
    auVar166._4_4_ = uVar113;
    auVar166._0_4_ = uVar113;
    auVar166._8_4_ = uVar113;
    auVar166._12_4_ = uVar113;
    auVar6 = vshufps_avx(auVar7,auVar7,0x55);
    auVar7 = vshufps_avx(auVar7,auVar7,0xaa);
    aVar3 = (local_630->vx).field_0;
    aVar4 = (local_630->vy).field_0;
    fVar190 = (local_630->vz).field_0.m128[0];
    fVar149 = *(float *)((long)&(local_630->vz).field_0 + 4);
    fVar195 = *(float *)((long)&(local_630->vz).field_0 + 8);
    fVar148 = *(float *)((long)&(local_630->vz).field_0 + 0xc);
    auVar181._0_4_ = fVar190 * auVar7._0_4_;
    auVar181._4_4_ = fVar149 * auVar7._4_4_;
    auVar181._8_4_ = fVar195 * auVar7._8_4_;
    auVar181._12_4_ = fVar148 * auVar7._12_4_;
    auVar6 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar4,auVar6);
    auVar12 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar3,auVar166);
    auVar6 = vblendps_avx(auVar12,auVar11,8);
    auVar8 = vsubps_avx(auVar228,auVar9);
    uVar113 = auVar8._0_4_;
    auVar182._4_4_ = uVar113;
    auVar182._0_4_ = uVar113;
    auVar182._8_4_ = uVar113;
    auVar182._12_4_ = uVar113;
    auVar7 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    auVar202._0_4_ = fVar190 * auVar8._0_4_;
    auVar202._4_4_ = fVar149 * auVar8._4_4_;
    auVar202._8_4_ = fVar195 * auVar8._8_4_;
    auVar202._12_4_ = fVar148 * auVar8._12_4_;
    auVar7 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar4,auVar7);
    auVar13 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar3,auVar182);
    auVar7 = vblendps_avx(auVar13,auVar228,8);
    auVar10 = vsubps_avx(local_6f0,auVar9);
    uVar113 = auVar10._0_4_;
    auVar191._4_4_ = uVar113;
    auVar191._0_4_ = uVar113;
    auVar191._8_4_ = uVar113;
    auVar191._12_4_ = uVar113;
    auVar8 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar208._0_4_ = fVar190 * auVar10._0_4_;
    auVar208._4_4_ = fVar149 * auVar10._4_4_;
    auVar208._8_4_ = fVar195 * auVar10._8_4_;
    auVar208._12_4_ = fVar148 * auVar10._12_4_;
    auVar8 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar4,auVar8);
    auVar14 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar3,auVar191);
    auVar8 = vblendps_avx(auVar14,local_6f0,8);
    auVar10 = vsubps_avx(_local_640,auVar9);
    uVar113 = auVar10._0_4_;
    auVar192._4_4_ = uVar113;
    auVar192._0_4_ = uVar113;
    auVar192._8_4_ = uVar113;
    auVar192._12_4_ = uVar113;
    auVar9 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar169._0_4_ = fVar190 * auVar10._0_4_;
    auVar169._4_4_ = fVar149 * auVar10._4_4_;
    auVar169._8_4_ = fVar195 * auVar10._8_4_;
    auVar169._12_4_ = fVar148 * auVar10._12_4_;
    auVar9 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar4,auVar9);
    auVar180 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar3,auVar192);
    auVar9 = vblendps_avx(auVar180,_local_640,8);
    auVar137._8_4_ = 0x7fffffff;
    auVar137._0_8_ = 0x7fffffff7fffffff;
    auVar137._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx(auVar6,auVar137);
    auVar7 = vandps_avx(auVar7,auVar137);
    auVar10 = vmaxps_avx(auVar6,auVar7);
    auVar6 = vandps_avx(auVar8,auVar137);
    auVar7 = vandps_avx(auVar9,auVar137);
    auVar6 = vmaxps_avx(auVar6,auVar7);
    auVar6 = vmaxps_avx(auVar10,auVar6);
    auVar7 = vmovshdup_avx(auVar6);
    auVar7 = vmaxss_avx(auVar7,auVar6);
    auVar6 = vshufpd_avx(auVar6,auVar6,1);
    auVar6 = vmaxss_avx(auVar6,auVar7);
    lVar111 = (long)iVar104 * 0x44;
    auVar7 = vmovshdup_avx(auVar12);
    local_5a0 = auVar7._0_8_;
    auVar7 = vmovshdup_avx(auVar13);
    uVar114 = auVar7._0_8_;
    local_580._8_8_ = uVar114;
    local_580._0_8_ = uVar114;
    local_580._16_8_ = uVar114;
    local_580._24_8_ = uVar114;
    auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar111 + 0x908);
    uVar207 = auVar14._0_4_;
    auVar139._4_4_ = uVar207;
    auVar139._0_4_ = uVar207;
    auVar139._8_4_ = uVar207;
    auVar139._12_4_ = uVar207;
    auVar139._16_4_ = uVar207;
    auVar139._20_4_ = uVar207;
    auVar139._24_4_ = uVar207;
    auVar139._28_4_ = uVar207;
    auVar7 = vmovshdup_avx(auVar14);
    uVar114 = auVar7._0_8_;
    auVar204._8_8_ = uVar114;
    auVar204._0_8_ = uVar114;
    auVar204._16_8_ = uVar114;
    auVar204._24_8_ = uVar114;
    local_460 = *(float *)(bezier_basis0 + lVar111 + 0xd8c);
    fStack_53c = *(float *)(bezier_basis0 + lVar111 + 0xd90);
    fStack_538 = *(float *)(bezier_basis0 + lVar111 + 0xd94);
    fStack_534 = *(float *)(bezier_basis0 + lVar111 + 0xd98);
    fStack_450 = *(float *)(bezier_basis0 + lVar111 + 0xd9c);
    fStack_44c = *(float *)(bezier_basis0 + lVar111 + 0xda0);
    fStack_448 = *(float *)(bezier_basis0 + lVar111 + 0xda4);
    uStack_444 = *(undefined4 *)(bezier_basis0 + lVar111 + 0xda8);
    auVar7 = vmovshdup_avx(auVar180);
    uVar115 = auVar7._0_8_;
    fVar147 = auVar180._0_4_;
    auVar184._0_4_ = local_460 * fVar147;
    auVar184._4_4_ = fStack_53c * fVar147;
    auVar184._8_4_ = fStack_538 * fVar147;
    auVar184._12_4_ = fStack_534 * fVar147;
    auVar184._16_4_ = fStack_450 * fVar147;
    auVar184._20_4_ = fStack_44c * fVar147;
    auVar184._24_4_ = fStack_448 * fVar147;
    auVar184._28_4_ = 0;
    auVar8 = vfmadd231ps_fma(auVar184,auVar118,auVar139);
    fVar190 = auVar7._0_4_;
    auVar157._0_4_ = local_460 * fVar190;
    fVar195 = auVar7._4_4_;
    auVar157._4_4_ = fStack_53c * fVar195;
    auVar157._8_4_ = fStack_538 * fVar190;
    auVar157._12_4_ = fStack_534 * fVar195;
    auVar157._16_4_ = fStack_450 * fVar190;
    auVar157._20_4_ = fStack_44c * fVar195;
    auVar157._24_4_ = fStack_448 * fVar190;
    auVar157._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar157,auVar118,auVar204);
    auVar24 = *(undefined1 (*) [32])(bezier_basis0 + lVar111 + 0x484);
    uVar113 = auVar13._0_4_;
    auVar212._4_4_ = uVar113;
    auVar212._0_4_ = uVar113;
    auVar212._8_4_ = uVar113;
    auVar212._12_4_ = uVar113;
    auVar212._16_4_ = uVar113;
    auVar212._20_4_ = uVar113;
    auVar212._24_4_ = uVar113;
    auVar212._28_4_ = uVar113;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar212);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,local_580);
    auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar111);
    uVar113 = auVar12._0_4_;
    auVar193._4_4_ = uVar113;
    auVar193._0_4_ = uVar113;
    auVar193._8_4_ = uVar113;
    auVar193._12_4_ = uVar113;
    auVar193._16_4_ = uVar113;
    auVar193._20_4_ = uVar113;
    auVar193._24_4_ = uVar113;
    auVar193._28_4_ = uVar113;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar126,auVar193);
    auVar98._8_8_ = local_5a0;
    auVar98._0_8_ = local_5a0;
    auVar98._16_8_ = local_5a0;
    auVar98._24_8_ = local_5a0;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar126,auVar98);
    local_480 = *(undefined1 (*) [32])(bezier_basis1 + lVar111 + 0x908);
    local_4a0 = *(float *)(bezier_basis1 + lVar111 + 0xd8c);
    fStack_49c = *(float *)(bezier_basis1 + lVar111 + 0xd90);
    fStack_498 = *(float *)(bezier_basis1 + lVar111 + 0xd94);
    fStack_494 = *(float *)(bezier_basis1 + lVar111 + 0xd98);
    fStack_490 = *(float *)(bezier_basis1 + lVar111 + 0xd9c);
    fStack_48c = *(float *)(bezier_basis1 + lVar111 + 0xda0);
    fStack_488 = *(float *)(bezier_basis1 + lVar111 + 0xda4);
    uStack_484 = *(undefined4 *)(bezier_basis1 + lVar111 + 0xda8);
    auVar27._4_4_ = fVar147 * fStack_49c;
    auVar27._0_4_ = fVar147 * local_4a0;
    auVar27._8_4_ = fVar147 * fStack_498;
    auVar27._12_4_ = fVar147 * fStack_494;
    auVar27._16_4_ = fVar147 * fStack_490;
    auVar27._20_4_ = fVar147 * fStack_48c;
    auVar27._24_4_ = fVar147 * fStack_488;
    auVar27._28_4_ = fVar147;
    auVar9 = vfmadd231ps_fma(auVar27,local_480,auVar139);
    auVar28._4_4_ = fVar195 * fStack_49c;
    auVar28._0_4_ = fVar190 * local_4a0;
    auVar28._8_4_ = fVar190 * fStack_498;
    auVar28._12_4_ = fVar195 * fStack_494;
    auVar28._16_4_ = fVar190 * fStack_490;
    auVar28._20_4_ = fVar195 * fStack_48c;
    auVar28._24_4_ = fVar190 * fStack_488;
    auVar28._28_4_ = uVar207;
    auVar10 = vfmadd231ps_fma(auVar28,local_480,auVar204);
    auVar144 = *(undefined1 (*) [32])(bezier_basis1 + lVar111 + 0x484);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar144,auVar212);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar144,local_580);
    auVar129 = *(undefined1 (*) [32])(bezier_basis1 + lVar111);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar129,auVar193);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar129,auVar98);
    auVar119 = ZEXT1632(auVar9);
    local_400 = ZEXT1632(auVar8);
    local_420 = vsubps_avx(auVar119,local_400);
    _local_600 = ZEXT1632(auVar10);
    local_520 = ZEXT1632(auVar7);
    _local_440 = vsubps_avx(_local_600,local_520);
    auVar120._0_4_ = auVar7._0_4_ * local_420._0_4_;
    auVar120._4_4_ = auVar7._4_4_ * local_420._4_4_;
    auVar120._8_4_ = auVar7._8_4_ * local_420._8_4_;
    auVar120._12_4_ = auVar7._12_4_ * local_420._12_4_;
    auVar120._16_4_ = local_420._16_4_ * 0.0;
    auVar120._20_4_ = local_420._20_4_ * 0.0;
    auVar120._24_4_ = local_420._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    fVar130 = local_440._0_4_;
    auVar140._0_4_ = fVar130 * auVar8._0_4_;
    fVar131 = local_440._4_4_;
    auVar140._4_4_ = fVar131 * auVar8._4_4_;
    fVar132 = local_440._8_4_;
    auVar140._8_4_ = fVar132 * auVar8._8_4_;
    fVar133 = local_440._12_4_;
    auVar140._12_4_ = fVar133 * auVar8._12_4_;
    fVar134 = local_440._16_4_;
    auVar140._16_4_ = fVar134 * 0.0;
    fVar135 = local_440._20_4_;
    auVar140._20_4_ = fVar135 * 0.0;
    fVar220 = local_440._24_4_;
    auVar140._24_4_ = fVar220 * 0.0;
    auVar140._28_4_ = 0;
    auVar199 = vsubps_avx(auVar120,auVar140);
    auVar8 = vpermilps_avx(auVar11,0xff);
    uVar114 = auVar8._0_8_;
    local_a0._8_8_ = uVar114;
    local_a0._0_8_ = uVar114;
    local_a0._16_8_ = uVar114;
    local_a0._24_8_ = uVar114;
    auVar7 = vpermilps_avx(auVar228,0xff);
    uVar114 = auVar7._0_8_;
    local_c0._8_8_ = uVar114;
    local_c0._0_8_ = uVar114;
    local_c0._16_8_ = uVar114;
    local_c0._24_8_ = uVar114;
    auVar7 = vshufps_avx(local_6f0,local_6f0,0xff);
    uVar114 = auVar7._0_8_;
    auVar230._8_8_ = uVar114;
    auVar230._0_8_ = uVar114;
    auVar230._16_8_ = uVar114;
    auVar230._24_8_ = uVar114;
    auVar7 = vpermilps_avx(_local_640,0xff);
    local_e0 = auVar7._0_8_;
    fVar149 = auVar7._0_4_;
    auVar185._0_4_ = local_460 * fVar149;
    fVar148 = auVar7._4_4_;
    auVar185._4_4_ = fStack_53c * fVar148;
    auVar185._8_4_ = fStack_538 * fVar149;
    auVar185._12_4_ = fStack_534 * fVar148;
    auVar185._16_4_ = fStack_450 * fVar149;
    auVar185._20_4_ = fStack_44c * fVar148;
    auVar185._24_4_ = fStack_448 * fVar149;
    auVar185._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar185,auVar230,auVar118);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,local_c0);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar126,local_a0);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar29._4_4_ = fVar148 * fStack_49c;
    auVar29._0_4_ = fVar149 * local_4a0;
    auVar29._8_4_ = fVar149 * fStack_498;
    auVar29._12_4_ = fVar148 * fStack_494;
    auVar29._16_4_ = fVar149 * fStack_490;
    auVar29._20_4_ = fVar148 * fStack_48c;
    auVar29._24_4_ = fVar149 * fStack_488;
    auVar29._28_4_ = uVar113;
    auVar7 = vfmadd231ps_fma(auVar29,local_480,auVar230);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar144,local_c0);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar129,local_a0);
    auVar30._4_4_ = fVar131 * fVar131;
    auVar30._0_4_ = fVar130 * fVar130;
    auVar30._8_4_ = fVar132 * fVar132;
    auVar30._12_4_ = fVar133 * fVar133;
    auVar30._16_4_ = fVar134 * fVar134;
    auVar30._20_4_ = fVar135 * fVar135;
    auVar30._24_4_ = fVar220 * fVar220;
    auVar30._28_4_ = auVar8._4_4_;
    auVar7 = vfmadd231ps_fma(auVar30,local_420,local_420);
    auVar22 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
    auVar31._4_4_ = auVar22._4_4_ * auVar22._4_4_ * auVar7._4_4_;
    auVar31._0_4_ = auVar22._0_4_ * auVar22._0_4_ * auVar7._0_4_;
    auVar31._8_4_ = auVar22._8_4_ * auVar22._8_4_ * auVar7._8_4_;
    auVar31._12_4_ = auVar22._12_4_ * auVar22._12_4_ * auVar7._12_4_;
    auVar31._16_4_ = auVar22._16_4_ * auVar22._16_4_ * 0.0;
    auVar31._20_4_ = auVar22._20_4_ * auVar22._20_4_ * 0.0;
    auVar31._24_4_ = auVar22._24_4_ * auVar22._24_4_ * 0.0;
    auVar31._28_4_ = auVar22._28_4_;
    auVar32._4_4_ = auVar199._4_4_ * auVar199._4_4_;
    auVar32._0_4_ = auVar199._0_4_ * auVar199._0_4_;
    auVar32._8_4_ = auVar199._8_4_ * auVar199._8_4_;
    auVar32._12_4_ = auVar199._12_4_ * auVar199._12_4_;
    auVar32._16_4_ = auVar199._16_4_ * auVar199._16_4_;
    auVar32._20_4_ = auVar199._20_4_ * auVar199._20_4_;
    auVar32._24_4_ = auVar199._24_4_ * auVar199._24_4_;
    auVar32._28_4_ = auVar199._28_4_;
    auVar22 = vcmpps_avx(auVar32,auVar31,2);
    fVar149 = auVar6._0_4_ * 4.7683716e-07;
    auVar121._0_4_ = (float)iVar104;
    auVar121._4_4_ = auVar121._0_4_;
    auVar121._8_4_ = auVar121._0_4_;
    auVar121._12_4_ = auVar121._0_4_;
    auVar121._16_4_ = auVar121._0_4_;
    auVar121._20_4_ = auVar121._0_4_;
    auVar121._24_4_ = auVar121._0_4_;
    auVar121._28_4_ = auVar121._0_4_;
    auVar199 = vcmpps_avx(_DAT_01f7b060,auVar121,1);
    auVar6 = vpermilps_avx(auVar12,0xaa);
    uVar114 = auVar6._0_8_;
    local_680._8_8_ = uVar114;
    local_680._0_8_ = uVar114;
    local_680._16_8_ = uVar114;
    local_680._24_8_ = uVar114;
    auVar6 = vpermilps_avx(auVar13,0xaa);
    uVar114 = auVar6._0_8_;
    local_5c0._8_8_ = uVar114;
    local_5c0._0_8_ = uVar114;
    local_5c0._16_8_ = uVar114;
    local_5c0._24_8_ = uVar114;
    auVar6 = vpermilps_avx(auVar14,0xaa);
    uVar114 = auVar6._0_8_;
    local_500._8_8_ = uVar114;
    local_500._0_8_ = uVar114;
    local_500._16_8_ = uVar114;
    local_500._24_8_ = uVar114;
    auVar7 = vpermilps_avx(auVar180,0xaa);
    uVar114 = auVar7._0_8_;
    auVar117 = auVar199 & auVar22;
    local_550 = ZEXT416((uint)local_5e0._4_4_);
    uVar109 = *(uint *)(ray + k * 4 + 0x60);
    local_720._0_16_ = ZEXT416(uVar109);
    local_770 = auVar11._0_8_;
    uStack_768 = auVar11._8_8_;
    local_780 = auVar228._0_8_;
    uStack_778 = auVar228._8_8_;
    uStack_6d8 = uVar114;
    uStack_6d0 = uVar114;
    uStack_6c8 = uVar114;
    uStack_598 = local_5a0;
    uStack_590 = local_5a0;
    uStack_588 = local_5a0;
    local_540 = auVar121._0_4_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      uVar108 = 0;
      auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,CONCAT416(fVar190,
                                                  CONCAT412(fVar195,CONCAT48(fVar190,uVar115)))))));
      auVar194 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar147,CONCAT420(fVar147,CONCAT416(fVar147,
                                                  CONCAT412(fVar147,CONCAT48(fVar147,CONCAT44(
                                                  fVar147,fVar147))))))));
    }
    else {
      local_100 = vandps_avx(auVar22,auVar199);
      fVar220 = auVar7._0_4_;
      fVar223 = auVar7._4_4_;
      auVar33._4_4_ = fVar223 * fStack_49c;
      auVar33._0_4_ = fVar220 * local_4a0;
      auVar33._8_4_ = fVar220 * fStack_498;
      auVar33._12_4_ = fVar223 * fStack_494;
      auVar33._16_4_ = fVar220 * fStack_490;
      auVar33._20_4_ = fVar223 * fStack_48c;
      auVar33._24_4_ = fVar220 * fStack_488;
      auVar33._28_4_ = local_100._28_4_;
      auVar7 = vfmadd213ps_fma(local_480,local_500,auVar33);
      auVar7 = vfmadd213ps_fma(auVar144,local_5c0,ZEXT1632(auVar7));
      auVar7 = vfmadd213ps_fma(auVar129,local_680,ZEXT1632(auVar7));
      auVar122._0_4_ = fVar220 * local_460;
      auVar122._4_4_ = fVar223 * fStack_53c;
      auVar122._8_4_ = fVar220 * fStack_538;
      auVar122._12_4_ = fVar223 * fStack_534;
      auVar122._16_4_ = fVar220 * fStack_450;
      auVar122._20_4_ = fVar223 * fStack_44c;
      auVar122._24_4_ = fVar220 * fStack_448;
      auVar122._28_4_ = 0;
      auVar8 = vfmadd213ps_fma(auVar118,local_500,auVar122);
      auVar8 = vfmadd213ps_fma(auVar24,local_5c0,ZEXT1632(auVar8));
      auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar111 + 0x1210);
      auVar24 = *(undefined1 (*) [32])(bezier_basis0 + lVar111 + 0x1694);
      auVar144 = *(undefined1 (*) [32])(bezier_basis0 + lVar111 + 0x1b18);
      fVar148 = *(float *)(bezier_basis0 + lVar111 + 0x1f9c);
      fVar130 = *(float *)(bezier_basis0 + lVar111 + 0x1fa0);
      fVar131 = *(float *)(bezier_basis0 + lVar111 + 0x1fa4);
      fVar132 = *(float *)(bezier_basis0 + lVar111 + 0x1fa8);
      fVar133 = *(float *)(bezier_basis0 + lVar111 + 0x1fac);
      fVar134 = *(float *)(bezier_basis0 + lVar111 + 0x1fb0);
      fVar135 = *(float *)(bezier_basis0 + lVar111 + 0x1fb4);
      auVar34._4_4_ = fVar147 * fVar130;
      auVar34._0_4_ = fVar147 * fVar148;
      auVar34._8_4_ = fVar147 * fVar131;
      auVar34._12_4_ = fVar147 * fVar132;
      auVar34._16_4_ = fVar147 * fVar133;
      auVar34._20_4_ = fVar147 * fVar134;
      auVar34._24_4_ = fVar147 * fVar135;
      auVar34._28_4_ = local_480._28_4_;
      auVar198._0_4_ = fVar148 * fVar190;
      auVar198._4_4_ = fVar130 * fVar195;
      auVar198._8_4_ = fVar131 * fVar190;
      auVar198._12_4_ = fVar132 * fVar195;
      auVar198._16_4_ = fVar133 * fVar190;
      auVar198._20_4_ = fVar134 * fVar195;
      auVar198._24_4_ = fVar135 * fVar190;
      auVar198._28_4_ = 0;
      auVar35._4_4_ = fVar223 * fVar130;
      auVar35._0_4_ = fVar220 * fVar148;
      auVar35._8_4_ = fVar220 * fVar131;
      auVar35._12_4_ = fVar223 * fVar132;
      auVar35._16_4_ = fVar220 * fVar133;
      auVar35._20_4_ = fVar223 * fVar134;
      auVar35._24_4_ = fVar220 * fVar135;
      auVar35._28_4_ = auVar6._4_4_;
      auVar6 = vfmadd231ps_fma(auVar34,auVar144,auVar139);
      auVar12 = vfmadd231ps_fma(auVar198,auVar144,auVar204);
      auVar13 = vfmadd231ps_fma(auVar35,local_500,auVar144);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar24,auVar212);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar24,local_580);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_5c0,auVar24);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar118,auVar193);
      auVar99._8_8_ = local_5a0;
      auVar99._0_8_ = local_5a0;
      auVar99._16_8_ = local_5a0;
      auVar99._24_8_ = local_5a0;
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,auVar99);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar118,local_680);
      fVar148 = *(float *)(bezier_basis1 + lVar111 + 0x1f9c);
      fVar130 = *(float *)(bezier_basis1 + lVar111 + 0x1fa0);
      fVar131 = *(float *)(bezier_basis1 + lVar111 + 0x1fa4);
      fVar132 = *(float *)(bezier_basis1 + lVar111 + 0x1fa8);
      fVar133 = *(float *)(bezier_basis1 + lVar111 + 0x1fac);
      fVar134 = *(float *)(bezier_basis1 + lVar111 + 0x1fb0);
      fVar135 = *(float *)(bezier_basis1 + lVar111 + 0x1fb4);
      auVar36._4_4_ = fVar147 * fVar130;
      auVar36._0_4_ = fVar147 * fVar148;
      auVar36._8_4_ = fVar147 * fVar131;
      auVar36._12_4_ = fVar147 * fVar132;
      auVar36._16_4_ = fVar147 * fVar133;
      auVar36._20_4_ = fVar147 * fVar134;
      auVar36._24_4_ = fVar147 * fVar135;
      auVar36._28_4_ = auVar118._28_4_;
      auVar37._4_4_ = fVar195 * fVar130;
      auVar37._0_4_ = fVar190 * fVar148;
      auVar37._8_4_ = fVar190 * fVar131;
      auVar37._12_4_ = fVar195 * fVar132;
      auVar37._16_4_ = fVar190 * fVar133;
      auVar37._20_4_ = fVar195 * fVar134;
      auVar37._24_4_ = fVar190 * fVar135;
      auVar37._28_4_ = fVar147;
      auVar38._4_4_ = fVar223 * fVar130;
      auVar38._0_4_ = fVar220 * fVar148;
      auVar38._8_4_ = fVar220 * fVar131;
      auVar38._12_4_ = fVar223 * fVar132;
      auVar38._16_4_ = fVar220 * fVar133;
      auVar38._20_4_ = fVar223 * fVar134;
      auVar38._24_4_ = fVar220 * fVar135;
      auVar38._28_4_ = fVar223;
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar111 + 0x1b18);
      auVar14 = vfmadd231ps_fma(auVar36,auVar118,auVar139);
      auVar180 = vfmadd231ps_fma(auVar37,auVar118,auVar204);
      auVar116 = vfmadd231ps_fma(auVar38,auVar118,local_500);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar111 + 0x1694);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar118,auVar212);
      auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar118,local_580);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar118,local_5c0);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar111 + 0x1210);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar118,auVar193);
      auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar118,auVar99);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_680,auVar118);
      auVar118 = vandps_avx(local_3c0,ZEXT1632(auVar6));
      auVar24 = vandps_avx(ZEXT1632(auVar12),local_3c0);
      auVar24 = vmaxps_avx(auVar118,auVar24);
      auVar118 = vandps_avx(ZEXT1632(auVar13),local_3c0);
      auVar118 = vmaxps_avx(auVar24,auVar118);
      auVar141._4_4_ = fVar149;
      auVar141._0_4_ = fVar149;
      auVar141._8_4_ = fVar149;
      auVar141._12_4_ = fVar149;
      auVar141._16_4_ = fVar149;
      auVar141._20_4_ = fVar149;
      auVar141._24_4_ = fVar149;
      auVar141._28_4_ = fVar149;
      auVar118 = vcmpps_avx(auVar118,auVar141,1);
      auVar144 = vblendvps_avx(ZEXT1632(auVar6),local_420,auVar118);
      auVar129 = vblendvps_avx(ZEXT1632(auVar12),_local_440,auVar118);
      auVar118 = vandps_avx(ZEXT1632(auVar14),local_3c0);
      auVar24 = vandps_avx(ZEXT1632(auVar180),local_3c0);
      auVar24 = vmaxps_avx(auVar118,auVar24);
      auVar118 = vandps_avx(ZEXT1632(auVar116),local_3c0);
      auVar118 = vmaxps_avx(auVar24,auVar118);
      auVar24 = vcmpps_avx(auVar118,auVar141,1);
      auVar118 = vblendvps_avx(ZEXT1632(auVar14),local_420,auVar24);
      auVar24 = vblendvps_avx(ZEXT1632(auVar180),_local_440,auVar24);
      auVar6 = vfmadd213ps_fma(auVar126,local_680,ZEXT1632(auVar8));
      auVar8 = vfmadd213ps_fma(auVar144,auVar144,ZEXT832(0) << 0x20);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar129,auVar129);
      auVar126 = vrsqrtps_avx(ZEXT1632(auVar8));
      fVar148 = auVar126._0_4_;
      fVar130 = auVar126._4_4_;
      fVar131 = auVar126._8_4_;
      fVar132 = auVar126._12_4_;
      fVar133 = auVar126._16_4_;
      fVar134 = auVar126._20_4_;
      fVar135 = auVar126._24_4_;
      auVar39._4_4_ = fVar130 * fVar130 * fVar130 * auVar8._4_4_ * -0.5;
      auVar39._0_4_ = fVar148 * fVar148 * fVar148 * auVar8._0_4_ * -0.5;
      auVar39._8_4_ = fVar131 * fVar131 * fVar131 * auVar8._8_4_ * -0.5;
      auVar39._12_4_ = fVar132 * fVar132 * fVar132 * auVar8._12_4_ * -0.5;
      auVar39._16_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar39._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar39._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar39._28_4_ = 0;
      auVar222._8_4_ = 0x3fc00000;
      auVar222._0_8_ = 0x3fc000003fc00000;
      auVar222._12_4_ = 0x3fc00000;
      auVar222._16_4_ = 0x3fc00000;
      auVar222._20_4_ = 0x3fc00000;
      auVar222._24_4_ = 0x3fc00000;
      auVar222._28_4_ = 0x3fc00000;
      auVar8 = vfmadd231ps_fma(auVar39,auVar222,auVar126);
      fVar148 = auVar8._0_4_;
      fVar130 = auVar8._4_4_;
      auVar40._4_4_ = auVar129._4_4_ * fVar130;
      auVar40._0_4_ = auVar129._0_4_ * fVar148;
      fVar131 = auVar8._8_4_;
      auVar40._8_4_ = auVar129._8_4_ * fVar131;
      fVar132 = auVar8._12_4_;
      auVar40._12_4_ = auVar129._12_4_ * fVar132;
      auVar40._16_4_ = auVar129._16_4_ * 0.0;
      auVar40._20_4_ = auVar129._20_4_ * 0.0;
      auVar40._24_4_ = auVar129._24_4_ * 0.0;
      auVar40._28_4_ = auVar126._28_4_;
      auVar41._4_4_ = -auVar144._4_4_ * fVar130;
      auVar41._0_4_ = -auVar144._0_4_ * fVar148;
      auVar41._8_4_ = -auVar144._8_4_ * fVar131;
      auVar41._12_4_ = -auVar144._12_4_ * fVar132;
      auVar41._16_4_ = -auVar144._16_4_ * 0.0;
      auVar41._20_4_ = -auVar144._20_4_ * 0.0;
      auVar41._24_4_ = -auVar144._24_4_ * 0.0;
      auVar41._28_4_ = 0;
      auVar8 = vfmadd213ps_fma(auVar118,auVar118,ZEXT832(0) << 0x20);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar24,auVar24);
      auVar126 = vrsqrtps_avx(ZEXT1632(auVar8));
      auVar144 = ZEXT1632(CONCAT412(fVar132 * 0.0,
                                    CONCAT48(fVar131 * 0.0,CONCAT44(fVar130 * 0.0,fVar148 * 0.0))));
      fVar148 = auVar126._0_4_;
      fVar130 = auVar126._4_4_;
      fVar131 = auVar126._8_4_;
      fVar132 = auVar126._12_4_;
      fVar133 = auVar126._16_4_;
      fVar134 = auVar126._20_4_;
      fVar135 = auVar126._24_4_;
      auVar42._4_4_ = fVar130 * fVar130 * fVar130 * auVar8._4_4_ * -0.5;
      auVar42._0_4_ = fVar148 * fVar148 * fVar148 * auVar8._0_4_ * -0.5;
      auVar42._8_4_ = fVar131 * fVar131 * fVar131 * auVar8._8_4_ * -0.5;
      auVar42._12_4_ = fVar132 * fVar132 * fVar132 * auVar8._12_4_ * -0.5;
      auVar42._16_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar42._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar42._24_4_ = fVar135 * fVar135 * fVar135 * -0.0;
      auVar42._28_4_ = 0xbf000000;
      auVar8 = vfmadd231ps_fma(auVar42,auVar222,auVar126);
      fVar148 = auVar8._0_4_;
      fVar130 = auVar8._4_4_;
      auVar43._4_4_ = fVar130 * auVar24._4_4_;
      auVar43._0_4_ = fVar148 * auVar24._0_4_;
      fVar131 = auVar8._8_4_;
      auVar43._8_4_ = fVar131 * auVar24._8_4_;
      fVar132 = auVar8._12_4_;
      auVar43._12_4_ = fVar132 * auVar24._12_4_;
      auVar43._16_4_ = auVar24._16_4_ * 0.0;
      auVar43._20_4_ = auVar24._20_4_ * 0.0;
      auVar43._24_4_ = auVar24._24_4_ * 0.0;
      auVar43._28_4_ = 0;
      auVar44._4_4_ = fVar130 * -auVar118._4_4_;
      auVar44._0_4_ = fVar148 * -auVar118._0_4_;
      auVar44._8_4_ = fVar131 * -auVar118._8_4_;
      auVar44._12_4_ = fVar132 * -auVar118._12_4_;
      auVar44._16_4_ = -auVar118._16_4_ * 0.0;
      auVar44._20_4_ = -auVar118._20_4_ * 0.0;
      auVar44._24_4_ = -auVar118._24_4_ * 0.0;
      auVar44._28_4_ = 0x3fc00000;
      auVar45._28_4_ = auVar126._28_4_;
      auVar45._0_28_ =
           ZEXT1628(CONCAT412(fVar132 * 0.0,
                              CONCAT48(fVar131 * 0.0,CONCAT44(fVar130 * 0.0,fVar148 * 0.0))));
      auVar8 = vfmadd213ps_fma(auVar40,ZEXT1632(auVar9),local_400);
      auVar118 = ZEXT1632(auVar9);
      auVar12 = vfmadd213ps_fma(auVar41,auVar118,local_520);
      auVar13 = vfmadd213ps_fma(auVar144,auVar118,ZEXT1632(auVar6));
      auVar180 = vfnmadd213ps_fma(auVar40,auVar118,local_400);
      auVar14 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar10),auVar119);
      auVar116 = vfnmadd213ps_fma(auVar41,auVar118,local_520);
      auVar173 = ZEXT1632(auVar10);
      auVar10 = vfmadd213ps_fma(auVar44,auVar173,_local_600);
      auVar172 = ZEXT1632(auVar9);
      auVar150 = vfnmadd231ps_fma(ZEXT1632(auVar6),auVar172,auVar144);
      auVar9 = vfmadd213ps_fma(auVar45,auVar173,ZEXT1632(auVar7));
      auVar136 = vfnmadd213ps_fma(auVar43,auVar173,auVar119);
      auVar137 = vfnmadd213ps_fma(auVar44,auVar173,_local_600);
      auVar164 = vfnmadd231ps_fma(ZEXT1632(auVar7),auVar173,auVar45);
      auVar118 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar116));
      auVar24 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar150));
      auVar158._0_4_ = auVar150._0_4_ * auVar118._0_4_;
      auVar158._4_4_ = auVar150._4_4_ * auVar118._4_4_;
      auVar158._8_4_ = auVar150._8_4_ * auVar118._8_4_;
      auVar158._12_4_ = auVar150._12_4_ * auVar118._12_4_;
      auVar158._16_4_ = auVar118._16_4_ * 0.0;
      auVar158._20_4_ = auVar118._20_4_ * 0.0;
      auVar158._24_4_ = auVar118._24_4_ * 0.0;
      auVar158._28_4_ = 0;
      auVar7 = vfmsub231ps_fma(auVar158,ZEXT1632(auVar116),auVar24);
      auVar46._4_4_ = auVar180._4_4_ * auVar24._4_4_;
      auVar46._0_4_ = auVar180._0_4_ * auVar24._0_4_;
      auVar46._8_4_ = auVar180._8_4_ * auVar24._8_4_;
      auVar46._12_4_ = auVar180._12_4_ * auVar24._12_4_;
      auVar46._16_4_ = auVar24._16_4_ * 0.0;
      auVar46._20_4_ = auVar24._20_4_ * 0.0;
      auVar46._24_4_ = auVar24._24_4_ * 0.0;
      auVar46._28_4_ = auVar24._28_4_;
      auVar199 = ZEXT1632(auVar180);
      auVar24 = vsubps_avx(ZEXT1632(auVar14),auVar199);
      auVar6 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar150),auVar24);
      auVar47._4_4_ = auVar116._4_4_ * auVar24._4_4_;
      auVar47._0_4_ = auVar116._0_4_ * auVar24._0_4_;
      auVar47._8_4_ = auVar116._8_4_ * auVar24._8_4_;
      auVar47._12_4_ = auVar116._12_4_ * auVar24._12_4_;
      auVar47._16_4_ = auVar24._16_4_ * 0.0;
      auVar47._20_4_ = auVar24._20_4_ * 0.0;
      auVar47._24_4_ = auVar24._24_4_ * 0.0;
      auVar47._28_4_ = auVar24._28_4_;
      auVar180 = vfmsub231ps_fma(auVar47,auVar199,auVar118);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar180),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
      auVar128 = vcmpps_avx(ZEXT1632(auVar6),ZEXT832(0) << 0x20,2);
      auVar118 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar8),auVar128);
      auVar24 = vblendvps_avx(ZEXT1632(auVar137),ZEXT1632(auVar12),auVar128);
      auVar126 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar13),auVar128);
      auVar144 = vblendvps_avx(auVar199,ZEXT1632(auVar14),auVar128);
      auVar129 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar10),auVar128);
      auVar22 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar9),auVar128);
      auVar199 = vblendvps_avx(ZEXT1632(auVar14),auVar199,auVar128);
      auVar117 = vblendvps_avx(ZEXT1632(auVar10),ZEXT1632(auVar116),auVar128);
      auVar6 = vpackssdw_avx(local_100._0_16_,local_100._16_16_);
      auVar119 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar150),auVar128);
      auVar25 = vsubps_avx(auVar199,auVar118);
      auVar117 = vsubps_avx(auVar117,auVar24);
      auVar214 = vsubps_avx(auVar119,auVar126);
      auVar23 = vsubps_avx(auVar118,auVar144);
      auVar138 = vsubps_avx(auVar24,auVar129);
      auVar156 = vsubps_avx(auVar126,auVar22);
      auVar48._4_4_ = auVar214._4_4_ * auVar118._4_4_;
      auVar48._0_4_ = auVar214._0_4_ * auVar118._0_4_;
      auVar48._8_4_ = auVar214._8_4_ * auVar118._8_4_;
      auVar48._12_4_ = auVar214._12_4_ * auVar118._12_4_;
      auVar48._16_4_ = auVar214._16_4_ * auVar118._16_4_;
      auVar48._20_4_ = auVar214._20_4_ * auVar118._20_4_;
      auVar48._24_4_ = auVar214._24_4_ * auVar118._24_4_;
      auVar48._28_4_ = auVar119._28_4_;
      auVar7 = vfmsub231ps_fma(auVar48,auVar126,auVar25);
      auVar49._4_4_ = auVar25._4_4_ * auVar24._4_4_;
      auVar49._0_4_ = auVar25._0_4_ * auVar24._0_4_;
      auVar49._8_4_ = auVar25._8_4_ * auVar24._8_4_;
      auVar49._12_4_ = auVar25._12_4_ * auVar24._12_4_;
      auVar49._16_4_ = auVar25._16_4_ * auVar24._16_4_;
      auVar49._20_4_ = auVar25._20_4_ * auVar24._20_4_;
      auVar49._24_4_ = auVar25._24_4_ * auVar24._24_4_;
      auVar49._28_4_ = auVar199._28_4_;
      auVar8 = vfmsub231ps_fma(auVar49,auVar118,auVar117);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
      auVar123._0_4_ = auVar117._0_4_ * auVar126._0_4_;
      auVar123._4_4_ = auVar117._4_4_ * auVar126._4_4_;
      auVar123._8_4_ = auVar117._8_4_ * auVar126._8_4_;
      auVar123._12_4_ = auVar117._12_4_ * auVar126._12_4_;
      auVar123._16_4_ = auVar117._16_4_ * auVar126._16_4_;
      auVar123._20_4_ = auVar117._20_4_ * auVar126._20_4_;
      auVar123._24_4_ = auVar117._24_4_ * auVar126._24_4_;
      auVar123._28_4_ = 0;
      auVar8 = vfmsub231ps_fma(auVar123,auVar24,auVar214);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
      auVar124._0_4_ = auVar156._0_4_ * auVar144._0_4_;
      auVar124._4_4_ = auVar156._4_4_ * auVar144._4_4_;
      auVar124._8_4_ = auVar156._8_4_ * auVar144._8_4_;
      auVar124._12_4_ = auVar156._12_4_ * auVar144._12_4_;
      auVar124._16_4_ = auVar156._16_4_ * auVar144._16_4_;
      auVar124._20_4_ = auVar156._20_4_ * auVar144._20_4_;
      auVar124._24_4_ = auVar156._24_4_ * auVar144._24_4_;
      auVar124._28_4_ = 0;
      auVar7 = vfmsub231ps_fma(auVar124,auVar23,auVar22);
      auVar50._4_4_ = auVar138._4_4_ * auVar22._4_4_;
      auVar50._0_4_ = auVar138._0_4_ * auVar22._0_4_;
      auVar50._8_4_ = auVar138._8_4_ * auVar22._8_4_;
      auVar50._12_4_ = auVar138._12_4_ * auVar22._12_4_;
      auVar50._16_4_ = auVar138._16_4_ * auVar22._16_4_;
      auVar50._20_4_ = auVar138._20_4_ * auVar22._20_4_;
      auVar50._24_4_ = auVar138._24_4_ * auVar22._24_4_;
      auVar50._28_4_ = auVar22._28_4_;
      auVar9 = vfmsub231ps_fma(auVar50,auVar129,auVar156);
      auVar51._4_4_ = auVar23._4_4_ * auVar129._4_4_;
      auVar51._0_4_ = auVar23._0_4_ * auVar129._0_4_;
      auVar51._8_4_ = auVar23._8_4_ * auVar129._8_4_;
      auVar51._12_4_ = auVar23._12_4_ * auVar129._12_4_;
      auVar51._16_4_ = auVar23._16_4_ * auVar129._16_4_;
      auVar51._20_4_ = auVar23._20_4_ * auVar129._20_4_;
      auVar51._24_4_ = auVar23._24_4_ * auVar129._24_4_;
      auVar51._28_4_ = auVar129._28_4_;
      auVar10 = vfmsub231ps_fma(auVar51,auVar138,auVar144);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar7));
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
      auVar144 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
      auVar144 = vcmpps_avx(auVar144,ZEXT832(0) << 0x20,2);
      auVar7 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
      auVar6 = vpand_avx(auVar6,auVar7);
      auVar144 = vpmovsxwd_avx2(auVar6);
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar144 >> 0x7f,0) == '\0') &&
            (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar144 >> 0xbf,0) == '\0') &&
          (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar144[0x1f]) {
        auVar163 = ZEXT864(0) << 0x20;
LAB_0143d149:
        auVar194 = ZEXT3264(CONCAT824(uStack_608,
                                      CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
      }
      else {
        auVar52._4_4_ = auVar117._4_4_ * auVar156._4_4_;
        auVar52._0_4_ = auVar117._0_4_ * auVar156._0_4_;
        auVar52._8_4_ = auVar117._8_4_ * auVar156._8_4_;
        auVar52._12_4_ = auVar117._12_4_ * auVar156._12_4_;
        auVar52._16_4_ = auVar117._16_4_ * auVar156._16_4_;
        auVar52._20_4_ = auVar117._20_4_ * auVar156._20_4_;
        auVar52._24_4_ = auVar117._24_4_ * auVar156._24_4_;
        auVar52._28_4_ = auVar144._28_4_;
        auVar13 = vfmsub231ps_fma(auVar52,auVar138,auVar214);
        auVar142._0_4_ = auVar23._0_4_ * auVar214._0_4_;
        auVar142._4_4_ = auVar23._4_4_ * auVar214._4_4_;
        auVar142._8_4_ = auVar23._8_4_ * auVar214._8_4_;
        auVar142._12_4_ = auVar23._12_4_ * auVar214._12_4_;
        auVar142._16_4_ = auVar23._16_4_ * auVar214._16_4_;
        auVar142._20_4_ = auVar23._20_4_ * auVar214._20_4_;
        auVar142._24_4_ = auVar23._24_4_ * auVar214._24_4_;
        auVar142._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar142,auVar25,auVar156);
        auVar53._4_4_ = auVar25._4_4_ * auVar138._4_4_;
        auVar53._0_4_ = auVar25._0_4_ * auVar138._0_4_;
        auVar53._8_4_ = auVar25._8_4_ * auVar138._8_4_;
        auVar53._12_4_ = auVar25._12_4_ * auVar138._12_4_;
        auVar53._16_4_ = auVar25._16_4_ * auVar138._16_4_;
        auVar53._20_4_ = auVar25._20_4_ * auVar138._20_4_;
        auVar53._24_4_ = auVar25._24_4_ * auVar138._24_4_;
        auVar53._28_4_ = auVar25._28_4_;
        auVar14 = vfmsub231ps_fma(auVar53,auVar23,auVar117);
        auVar7 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar14));
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar13),_DAT_01f7b000);
        auVar144 = vrcpps_avx(ZEXT1632(auVar10));
        auVar213._8_4_ = 0x3f800000;
        auVar213._0_8_ = 0x3f8000003f800000;
        auVar213._12_4_ = 0x3f800000;
        auVar213._16_4_ = 0x3f800000;
        auVar213._20_4_ = 0x3f800000;
        auVar213._24_4_ = 0x3f800000;
        auVar213._28_4_ = 0x3f800000;
        auVar7 = vfnmadd213ps_fma(auVar144,ZEXT1632(auVar10),auVar213);
        auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar144,auVar144);
        auVar54._4_4_ = auVar14._4_4_ * auVar126._4_4_;
        auVar54._0_4_ = auVar14._0_4_ * auVar126._0_4_;
        auVar54._8_4_ = auVar14._8_4_ * auVar126._8_4_;
        auVar54._12_4_ = auVar14._12_4_ * auVar126._12_4_;
        auVar54._16_4_ = auVar126._16_4_ * 0.0;
        auVar54._20_4_ = auVar126._20_4_ * 0.0;
        auVar54._24_4_ = auVar126._24_4_ * 0.0;
        auVar54._28_4_ = auVar126._28_4_;
        auVar12 = vfmadd231ps_fma(auVar54,auVar24,ZEXT1632(auVar12));
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar13),auVar118);
        fVar148 = auVar7._0_4_;
        fVar130 = auVar7._4_4_;
        fVar131 = auVar7._8_4_;
        fVar132 = auVar7._12_4_;
        auVar55._28_4_ = auVar24._28_4_;
        auVar55._0_28_ =
             ZEXT1628(CONCAT412(fVar132 * auVar12._12_4_,
                                CONCAT48(fVar131 * auVar12._8_4_,
                                         CONCAT44(fVar130 * auVar12._4_4_,fVar148 * auVar12._0_4_)))
                     );
        auVar125._4_4_ = uVar109;
        auVar125._0_4_ = uVar109;
        auVar125._8_4_ = uVar109;
        auVar125._12_4_ = uVar109;
        auVar125._16_4_ = uVar109;
        auVar125._20_4_ = uVar109;
        auVar125._24_4_ = uVar109;
        auVar125._28_4_ = uVar109;
        uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar143._4_4_ = uVar113;
        auVar143._0_4_ = uVar113;
        auVar143._8_4_ = uVar113;
        auVar143._12_4_ = uVar113;
        auVar143._16_4_ = uVar113;
        auVar143._20_4_ = uVar113;
        auVar143._24_4_ = uVar113;
        auVar143._28_4_ = uVar113;
        auVar118 = vcmpps_avx(auVar125,auVar55,2);
        auVar24 = vcmpps_avx(auVar55,auVar143,2);
        auVar118 = vandps_avx(auVar24,auVar118);
        auVar7 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
        auVar6 = vpand_avx(auVar6,auVar7);
        auVar118 = vpmovsxwd_avx2(auVar6);
        auVar163 = ZEXT864(0) << 0x20;
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0x7f,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar118 >> 0xbf,0) == '\0') &&
            (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar118[0x1f]) goto LAB_0143d149;
        auVar118 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar10),4);
        auVar7 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
        auVar6 = vpand_avx(auVar6,auVar7);
        auVar118 = vpmovsxwd_avx2(auVar6);
        auVar194 = ZEXT3264(CONCAT824(uStack_608,
                                      CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          auVar126 = ZEXT1632(CONCAT412(fVar132 * auVar8._12_4_,
                                        CONCAT48(fVar131 * auVar8._8_4_,
                                                 CONCAT44(fVar130 * auVar8._4_4_,
                                                          fVar148 * auVar8._0_4_))));
          auVar144 = ZEXT1632(CONCAT412(fVar132 * auVar9._12_4_,
                                        CONCAT48(fVar131 * auVar9._8_4_,
                                                 CONCAT44(fVar130 * auVar9._4_4_,
                                                          fVar148 * auVar9._0_4_))));
          auVar174._8_4_ = 0x3f800000;
          auVar174._0_8_ = 0x3f8000003f800000;
          auVar174._12_4_ = 0x3f800000;
          auVar174._16_4_ = 0x3f800000;
          auVar174._20_4_ = 0x3f800000;
          auVar174._24_4_ = 0x3f800000;
          auVar174._28_4_ = 0x3f800000;
          auVar24 = vsubps_avx(auVar174,auVar126);
          _local_380 = vblendvps_avx(auVar24,auVar126,auVar128);
          auVar24 = vsubps_avx(auVar174,auVar144);
          local_4c0 = vblendvps_avx(auVar24,auVar144,auVar128);
          auVar194 = ZEXT3264(auVar118);
          local_3a0 = auVar55;
        }
      }
      auVar219 = ZEXT3264(auVar230);
      auVar118 = auVar194._0_32_;
      if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar118 >> 0x7f,0) == '\0') &&
            (auVar194 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar118 >> 0xbf,0) == '\0') &&
          (auVar194 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar194[0x1f]) {
        uVar108 = 0;
        auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,CONCAT416(fVar190,
                                                  CONCAT412(fVar195,CONCAT48(fVar190,uVar115)))))));
        auVar194 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar147,CONCAT420(fVar147,CONCAT416(fVar147,
                                                  CONCAT412(fVar147,CONCAT48(fVar147,CONCAT44(
                                                  fVar147,fVar147))))))));
      }
      else {
        auVar24 = vsubps_avx(auVar173,auVar172);
        auVar6 = vfmadd213ps_fma(auVar24,_local_380,auVar172);
        fVar148 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar56._4_4_ = (auVar6._4_4_ + auVar6._4_4_) * fVar148;
        auVar56._0_4_ = (auVar6._0_4_ + auVar6._0_4_) * fVar148;
        auVar56._8_4_ = (auVar6._8_4_ + auVar6._8_4_) * fVar148;
        auVar56._12_4_ = (auVar6._12_4_ + auVar6._12_4_) * fVar148;
        auVar56._16_4_ = fVar148 * 0.0;
        auVar56._20_4_ = fVar148 * 0.0;
        auVar56._24_4_ = fVar148 * 0.0;
        auVar56._28_4_ = 0;
        auVar24 = vcmpps_avx(local_3a0,auVar56,6);
        auVar126 = auVar118 & auVar24;
        auVar96._4_4_ = fVar147;
        auVar96._0_4_ = fVar147;
        auVar96._8_4_ = fVar147;
        auVar96._12_4_ = fVar147;
        auVar96._16_4_ = fVar147;
        auVar96._20_4_ = fVar147;
        auVar96._24_4_ = fVar147;
        auVar96._28_4_ = fVar147;
        auVar194 = ZEXT3264(auVar96);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) {
          uVar108 = 0;
          auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,CONCAT416(
                                                  fVar190,CONCAT412(fVar195,CONCAT48(fVar190,uVar115
                                                                                    )))))));
        }
        else {
          auVar145._8_4_ = 0xbf800000;
          auVar145._0_8_ = 0xbf800000bf800000;
          auVar145._12_4_ = 0xbf800000;
          auVar145._16_4_ = 0xbf800000;
          auVar145._20_4_ = 0xbf800000;
          auVar145._24_4_ = 0xbf800000;
          auVar145._28_4_ = 0xbf800000;
          auVar159._8_4_ = 0x40000000;
          auVar159._0_8_ = 0x4000000040000000;
          auVar159._12_4_ = 0x40000000;
          auVar159._16_4_ = 0x40000000;
          auVar159._20_4_ = 0x40000000;
          auVar159._24_4_ = 0x40000000;
          auVar159._28_4_ = 0x40000000;
          auVar6 = vfmadd213ps_fma(local_4c0,auVar159,auVar145);
          local_360 = _local_380;
          local_340 = ZEXT1632(auVar6);
          local_320 = local_3a0;
          local_300 = 0;
          local_2f0 = local_770;
          uStack_2e8 = uStack_768;
          local_2e0 = local_780;
          uStack_2d8 = uStack_778;
          local_2d0 = local_6f0._0_8_;
          uStack_2c8 = local_6f0._8_8_;
          local_4c0 = local_340;
          if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            uVar108 = 0;
            auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,CONCAT416(
                                                  fVar190,CONCAT412(fVar195,CONCAT48(fVar190,uVar115
                                                                                    )))))));
          }
          else {
            auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,CONCAT416(
                                                  fVar190,CONCAT412(fVar195,CONCAT48(fVar190,uVar115
                                                                                    )))))));
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar108 = CONCAT71((int7)((ulong)lVar112 >> 8),1),
               pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar118 = vandps_avx(auVar24,auVar118);
              fVar148 = 1.0 / auVar121._0_4_;
              local_280[0] = fVar148 * ((float)local_380._0_4_ + 0.0);
              local_280[1] = fVar148 * ((float)local_380._4_4_ + 1.0);
              local_280[2] = fVar148 * (fStack_378 + 2.0);
              local_280[3] = fVar148 * (fStack_374 + 3.0);
              fStack_270 = fVar148 * (fStack_370 + 4.0);
              fStack_26c = fVar148 * (fStack_36c + 5.0);
              fStack_268 = fVar148 * (fStack_368 + 6.0);
              fStack_264 = fStack_364 + 7.0;
              local_4c0._0_8_ = auVar6._0_8_;
              local_4c0._8_8_ = auVar6._8_8_;
              local_260 = local_4c0._0_8_;
              uStack_258 = local_4c0._8_8_;
              uStack_250 = 0;
              uStack_248 = 0;
              local_240 = local_3a0;
              uVar113 = vmovmskps_avx(auVar118);
              uVar108 = 0;
              uVar107 = CONCAT44((int)((ulong)lVar110 >> 0x20),uVar113);
              for (uVar26 = uVar107; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                uVar108 = uVar108 + 1;
              }
              local_6a0._4_4_ = uVar16;
              local_6a0._0_4_ = uVar16;
              local_6a0._8_4_ = uVar16;
              local_6a0._12_4_ = uVar16;
              local_6a0._16_4_ = uVar16;
              local_6a0._20_4_ = uVar16;
              local_6a0._24_4_ = uVar16;
              local_6a0._28_4_ = uVar16;
              local_5e0._0_4_ = local_5e0._4_4_;
              local_5e0._8_4_ = local_5e0._4_4_;
              local_5e0._12_4_ = local_5e0._4_4_;
              local_5e0._16_4_ = local_5e0._4_4_;
              local_5e0._20_4_ = local_5e0._4_4_;
              local_5e0._24_4_ = local_5e0._4_4_;
              local_5e0._28_4_ = local_5e0._4_4_;
              auVar118 = vpcmpeqd_avx2(auVar96,auVar96);
              auVar194 = ZEXT3264(auVar118);
              uVar224 = uVar114;
              uVar225 = uVar114;
              uVar226 = uVar114;
              local_6e0 = uVar114;
              local_6c0 = auVar230;
              fStack_45c = fStack_53c;
              fStack_458 = fStack_538;
              fStack_454 = fStack_534;
              local_2fc = iVar104;
              while (auVar230 = auVar219._0_32_, uVar107 != 0) {
                uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_1c0 = local_280[uVar108];
                local_1a0 = *(undefined4 *)((long)&local_260 + uVar108 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_240 + uVar108 * 4);
                fVar131 = 1.0 - local_1c0;
                auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar131 * fVar131)),
                                         ZEXT416((uint)(local_1c0 * fVar131)),ZEXT416(0xc0000000));
                auVar6 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar131)),
                                         ZEXT416((uint)(local_1c0 * local_1c0)),ZEXT416(0x40000000))
                ;
                fVar148 = auVar6._0_4_ * 3.0;
                fVar130 = local_1c0 * local_1c0 * 3.0;
                auVar175._0_4_ = fVar130 * (float)local_640._0_4_;
                auVar175._4_4_ = fVar130 * (float)local_640._4_4_;
                auVar175._8_4_ = fVar130 * fStack_638;
                auVar175._12_4_ = fVar130 * fStack_634;
                auVar151._4_4_ = fVar148;
                auVar151._0_4_ = fVar148;
                auVar151._8_4_ = fVar148;
                auVar151._12_4_ = fVar148;
                auVar6 = vfmadd132ps_fma(auVar151,auVar175,local_6f0);
                fVar148 = auVar7._0_4_ * 3.0;
                auVar170._4_4_ = fVar148;
                auVar170._0_4_ = fVar148;
                auVar170._8_4_ = fVar148;
                auVar170._12_4_ = fVar148;
                auVar6 = vfmadd132ps_fma(auVar170,auVar6,auVar228);
                fVar148 = fVar131 * fVar131 * -3.0;
                local_750.context = context->user;
                auVar152._4_4_ = fVar148;
                auVar152._0_4_ = fVar148;
                auVar152._8_4_ = fVar148;
                auVar152._12_4_ = fVar148;
                auVar7 = vfmadd132ps_fma(auVar152,auVar6,auVar11);
                local_220 = auVar7._0_4_;
                uStack_21c = local_220;
                uStack_218 = local_220;
                uStack_214 = local_220;
                uStack_210 = local_220;
                uStack_20c = local_220;
                uStack_208 = local_220;
                uStack_204 = local_220;
                auVar6 = vmovshdup_avx(auVar7);
                local_200 = auVar6._0_8_;
                uStack_1f8 = local_200;
                uStack_1f0 = local_200;
                uStack_1e8 = local_200;
                auVar6 = vshufps_avx(auVar7,auVar7,0xaa);
                local_1e0._8_8_ = auVar6._0_8_;
                local_1e0._0_8_ = local_1e0._8_8_;
                local_1e0._16_8_ = local_1e0._8_8_;
                local_1e0._24_8_ = local_1e0._8_8_;
                fStack_1bc = local_1c0;
                fStack_1b8 = local_1c0;
                fStack_1b4 = local_1c0;
                fStack_1b0 = local_1c0;
                fStack_1ac = local_1c0;
                fStack_1a8 = local_1c0;
                fStack_1a4 = local_1c0;
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_180 = local_5e0._0_8_;
                uStack_178 = local_5e0._8_8_;
                uStack_170 = local_5e0._16_8_;
                uStack_168 = local_5e0._24_8_;
                local_160 = local_6a0._0_8_;
                uStack_158 = local_6a0._8_8_;
                uStack_150 = local_6a0._16_8_;
                uStack_148 = local_6a0._24_8_;
                local_140 = (local_750.context)->instID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_120 = (local_750.context)->instPrimID[0];
                uStack_11c = local_120;
                uStack_118 = local_120;
                uStack_114 = local_120;
                uStack_110 = local_120;
                uStack_10c = local_120;
                uStack_108 = local_120;
                uStack_104 = local_120;
                local_660 = local_3e0;
                local_750.valid = (int *)local_660;
                local_750.geometryUserPtr = pGVar17->userPtr;
                local_750.hit = (RTCHitN *)&local_220;
                local_750.N = 8;
                local_750.ray = (RTCRayN *)ray;
                if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar118 = ZEXT1632(auVar194._0_16_);
                  (*pGVar17->occlusionFilterN)(&local_750);
                  auVar219 = ZEXT3264(local_6c0);
                  auVar118 = vpcmpeqd_avx2(auVar118,auVar118);
                  auVar194 = ZEXT3264(auVar118);
                  auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
                  uVar114 = local_6e0;
                  uVar224 = uStack_6d8;
                  uVar225 = uStack_6d0;
                  uVar226 = uStack_6c8;
                }
                auVar24 = vpcmpeqd_avx2(auVar163._0_32_,local_660);
                auVar118 = auVar194._0_32_ & ~auVar24;
                if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar118 >> 0x7f,0) == '\0') &&
                      (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar118 >> 0xbf,0) == '\0') &&
                    (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar118[0x1f]) {
                  auVar24 = auVar24 ^ auVar194._0_32_;
                  auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,
                                                  CONCAT416(fVar190,CONCAT412(fVar195,CONCAT48(
                                                  fVar190,uVar115)))))));
                }
                else {
                  p_Var21 = context->args->filter;
                  if (p_Var21 == (RTCFilterFunctionN)0x0) {
                    auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,
                                                  CONCAT416(fVar190,CONCAT412(fVar195,CONCAT48(
                                                  fVar190,uVar115)))))));
                  }
                  else {
                    auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,
                                                  CONCAT416(fVar190,CONCAT412(fVar195,CONCAT48(
                                                  fVar190,uVar115)))))));
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar17->field_8).field_0x2 & 0x40) != 0)) {
                      auVar118 = ZEXT1632(auVar194._0_16_);
                      (*p_Var21)(&local_750);
                      auVar219 = ZEXT3264(local_6c0);
                      auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,
                                                  CONCAT416(fVar190,CONCAT412(fVar195,CONCAT48(
                                                  fVar190,uVar115)))))));
                      auVar118 = vpcmpeqd_avx2(auVar118,auVar118);
                      auVar194 = ZEXT3264(auVar118);
                      auVar163 = ZEXT1664(ZEXT816(0) << 0x40);
                      uVar114 = local_6e0;
                      uVar224 = uStack_6d8;
                      uVar225 = uStack_6d0;
                      uVar226 = uStack_6c8;
                    }
                  }
                  auVar118 = vpcmpeqd_avx2(auVar163._0_32_,local_660);
                  auVar24 = auVar118 ^ auVar194._0_32_;
                  auVar160._8_4_ = 0xff800000;
                  auVar160._0_8_ = 0xff800000ff800000;
                  auVar160._12_4_ = 0xff800000;
                  auVar160._16_4_ = 0xff800000;
                  auVar160._20_4_ = 0xff800000;
                  auVar160._24_4_ = 0xff800000;
                  auVar160._28_4_ = 0xff800000;
                  auVar118 = vblendvps_avx(auVar160,*(undefined1 (*) [32])(local_750.ray + 0x100),
                                           auVar118);
                  *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar118;
                }
                auVar230 = auVar219._0_32_;
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar24 >> 0x7f,0) != '\0') ||
                      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0xbf,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar24[0x1f] < '\0') {
                  uVar108 = CONCAT71((int7)(uVar108 >> 8),1);
                  goto LAB_0143d189;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar113;
                uVar26 = uVar108 & 0x3f;
                uVar108 = 0;
                uVar107 = uVar107 ^ 1L << uVar26;
                for (uVar26 = uVar107; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
                {
                  uVar108 = uVar108 + 1;
                }
              }
              uVar108 = 0;
LAB_0143d189:
              auVar194 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar147,CONCAT420(fVar147,CONCAT416(
                                                  fVar147,CONCAT412(fVar147,CONCAT48(fVar147,
                                                  CONCAT44(fVar147,fVar147))))))));
              uStack_6d8 = uVar224;
              uStack_6d0 = uVar225;
              uStack_6c8 = uVar226;
            }
          }
        }
      }
    }
    auVar215 = ZEXT3264(auVar215._0_32_);
    auVar210 = ZEXT3264(auVar210._0_32_);
    auVar163 = ZEXT464((uint)fVar149);
    if (8 < iVar104) {
      local_400._4_4_ = iVar104;
      local_400._0_4_ = iVar104;
      local_400._8_4_ = iVar104;
      local_400._12_4_ = iVar104;
      local_400._16_4_ = iVar104;
      local_400._20_4_ = iVar104;
      local_400._24_4_ = iVar104;
      local_400._28_4_ = iVar104;
      local_440._4_4_ = fVar149;
      local_440._0_4_ = fVar149;
      fStack_438 = fVar149;
      fStack_434 = fVar149;
      fStack_430 = fVar149;
      fStack_42c = fVar149;
      fStack_428 = fVar149;
      fStack_424 = fVar149;
      local_460 = (float)local_720._0_4_;
      fStack_45c = (float)local_720._0_4_;
      fStack_458 = (float)local_720._0_4_;
      fStack_454 = (float)local_720._0_4_;
      fStack_450 = (float)local_720._0_4_;
      fStack_44c = (float)local_720._0_4_;
      fStack_448 = (float)local_720._0_4_;
      uStack_444 = local_720._0_4_;
      local_540 = 1.0 / local_540;
      local_480._4_4_ = uVar16;
      local_480._0_4_ = uVar16;
      local_480._8_4_ = uVar16;
      local_480._12_4_ = uVar16;
      local_480._16_4_ = uVar16;
      local_480._20_4_ = uVar16;
      local_480._24_4_ = uVar16;
      local_480._28_4_ = uVar16;
      local_4a0 = (float)local_550._0_4_;
      fStack_49c = (float)local_550._0_4_;
      fStack_498 = (float)local_550._0_4_;
      fStack_494 = (float)local_550._0_4_;
      fStack_490 = (float)local_550._0_4_;
      fStack_48c = (float)local_550._0_4_;
      fStack_488 = (float)local_550._0_4_;
      uStack_484 = local_550._0_4_;
      auVar5._8_8_ = uStack_598;
      auVar5._0_8_ = local_5a0;
      auVar5._16_8_ = uStack_590;
      auVar5._24_8_ = uStack_588;
      local_6e0 = uVar114;
      local_6c0 = auVar230;
      fStack_53c = local_540;
      fStack_538 = local_540;
      fStack_534 = local_540;
      fStack_530 = local_540;
      fStack_52c = local_540;
      fStack_528 = local_540;
      fStack_524 = local_540;
      for (lVar112 = 8; lVar112 < iVar104; lVar112 = lVar112 + 8) {
        auVar214 = auVar215._0_32_;
        auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar112 * 4 + lVar111);
        auVar24 = *(undefined1 (*) [32])(lVar111 + 0x21fb768 + lVar112 * 4);
        auVar126 = *(undefined1 (*) [32])(lVar111 + 0x21fbbec + lVar112 * 4);
        pauVar2 = (undefined1 (*) [28])(lVar111 + 0x21fc070 + lVar112 * 4);
        fVar135 = *(float *)*pauVar2;
        fVar220 = *(float *)(*pauVar2 + 4);
        fVar223 = *(float *)(*pauVar2 + 8);
        fVar85 = *(float *)(*pauVar2 + 0xc);
        fVar86 = *(float *)(*pauVar2 + 0x10);
        fVar87 = *(float *)(*pauVar2 + 0x14);
        fVar88 = *(float *)(*pauVar2 + 0x18);
        auVar102 = *pauVar2;
        auVar216._0_4_ = auVar194._0_4_ * fVar135;
        auVar216._4_4_ = auVar194._4_4_ * fVar220;
        auVar216._8_4_ = auVar194._8_4_ * fVar223;
        auVar216._12_4_ = auVar194._12_4_ * fVar85;
        auVar216._16_4_ = auVar194._16_4_ * fVar86;
        auVar216._20_4_ = auVar194._20_4_ * fVar87;
        auVar216._28_36_ = auVar215._28_36_;
        auVar216._24_4_ = auVar194._24_4_ * fVar88;
        auVar215._0_4_ = auVar189._0_4_ * fVar135;
        auVar215._4_4_ = auVar189._4_4_ * fVar220;
        auVar215._8_4_ = auVar189._8_4_ * fVar223;
        auVar215._12_4_ = auVar189._12_4_ * fVar85;
        auVar215._16_4_ = auVar189._16_4_ * fVar86;
        auVar215._20_4_ = auVar189._20_4_ * fVar87;
        auVar215._28_36_ = auVar163._28_36_;
        auVar215._24_4_ = auVar189._24_4_ * fVar88;
        auVar6 = vfmadd231ps_fma(auVar216._0_32_,auVar126,auVar139);
        auVar7 = vfmadd231ps_fma(auVar215._0_32_,auVar126,auVar204);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar24,auVar212);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar24,local_580);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar118,auVar193);
        auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar118,auVar5);
        auVar144 = *(undefined1 (*) [32])(bezier_basis1 + lVar112 * 4 + lVar111);
        auVar129 = *(undefined1 (*) [32])(lVar111 + 0x21fdb88 + lVar112 * 4);
        auVar22 = *(undefined1 (*) [32])(lVar111 + 0x21fe00c + lVar112 * 4);
        pfVar1 = (float *)(lVar111 + 0x21fe490 + lVar112 * 4);
        fVar89 = *pfVar1;
        fVar90 = pfVar1[1];
        fVar91 = pfVar1[2];
        fVar92 = pfVar1[3];
        fVar93 = pfVar1[4];
        fVar94 = pfVar1[5];
        fVar95 = pfVar1[6];
        auVar219._0_4_ = fVar89 * auVar194._0_4_;
        auVar219._4_4_ = fVar90 * auVar194._4_4_;
        auVar219._8_4_ = fVar91 * auVar194._8_4_;
        auVar219._12_4_ = fVar92 * auVar194._12_4_;
        auVar219._16_4_ = fVar93 * auVar194._16_4_;
        auVar219._20_4_ = fVar94 * auVar194._20_4_;
        auVar219._28_36_ = auVar194._28_36_;
        auVar219._24_4_ = fVar95 * auVar194._24_4_;
        auVar163._0_4_ = fVar89 * auVar189._0_4_;
        auVar163._4_4_ = fVar90 * auVar189._4_4_;
        auVar163._8_4_ = fVar91 * auVar189._8_4_;
        auVar163._12_4_ = fVar92 * auVar189._12_4_;
        auVar163._16_4_ = fVar93 * auVar189._16_4_;
        auVar163._20_4_ = fVar94 * auVar189._20_4_;
        auVar163._28_36_ = auVar189._28_36_;
        auVar163._24_4_ = fVar95 * auVar189._24_4_;
        auVar8 = vfmadd231ps_fma(auVar219._0_32_,auVar22,auVar139);
        auVar9 = vfmadd231ps_fma(auVar163._0_32_,auVar22,auVar204);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar129,auVar212);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar129,local_580);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar144,auVar193);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar144,auVar5);
        local_6a0 = ZEXT1632(auVar6);
        auVar117 = vsubps_avx(ZEXT1632(auVar8),local_6a0);
        local_5e0 = ZEXT1632(auVar9);
        local_720 = ZEXT1632(auVar7);
        auVar119 = vsubps_avx(local_5e0,local_720);
        auVar57._4_4_ = auVar117._4_4_ * auVar7._4_4_;
        auVar57._0_4_ = auVar117._0_4_ * auVar7._0_4_;
        auVar57._8_4_ = auVar117._8_4_ * auVar7._8_4_;
        auVar57._12_4_ = auVar117._12_4_ * auVar7._12_4_;
        auVar57._16_4_ = auVar117._16_4_ * 0.0;
        auVar57._20_4_ = auVar117._20_4_ * 0.0;
        auVar57._24_4_ = auVar117._24_4_ * 0.0;
        auVar57._28_4_ = auVar5._28_4_;
        fVar149 = auVar119._0_4_;
        fVar148 = auVar119._4_4_;
        auVar103._4_4_ = auVar6._4_4_ * fVar148;
        auVar103._0_4_ = auVar6._0_4_ * fVar149;
        fVar130 = auVar119._8_4_;
        auVar103._8_4_ = auVar6._8_4_ * fVar130;
        fVar131 = auVar119._12_4_;
        auVar103._12_4_ = auVar6._12_4_ * fVar131;
        fVar132 = auVar119._16_4_;
        auVar103._16_4_ = fVar132 * 0.0;
        fVar133 = auVar119._20_4_;
        auVar103._20_4_ = fVar133 * 0.0;
        fVar134 = auVar119._24_4_;
        auVar103._24_4_ = fVar134 * 0.0;
        auVar103._28_4_ = uVar207;
        auVar128 = vsubps_avx(auVar57,auVar103);
        auVar186._0_4_ = (float)local_e0 * fVar135;
        auVar186._4_4_ = local_e0._4_4_ * fVar220;
        auVar186._8_4_ = (float)uStack_d8 * fVar223;
        auVar186._12_4_ = uStack_d8._4_4_ * fVar85;
        auVar186._16_4_ = (float)uStack_d0 * fVar86;
        auVar186._20_4_ = uStack_d0._4_4_ * fVar87;
        auVar186._24_4_ = (float)uStack_c8 * fVar88;
        auVar186._28_4_ = 0;
        auVar6 = vfmadd231ps_fma(auVar186,local_6c0,auVar126);
        auVar163 = ZEXT3264(local_c0);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),local_c0,auVar24);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),local_a0,auVar118);
        auVar58._4_4_ = fVar90 * local_e0._4_4_;
        auVar58._0_4_ = fVar89 * (float)local_e0;
        auVar58._8_4_ = fVar91 * (float)uStack_d8;
        auVar58._12_4_ = fVar92 * uStack_d8._4_4_;
        auVar58._16_4_ = fVar93 * (float)uStack_d0;
        auVar58._20_4_ = fVar94 * uStack_d0._4_4_;
        auVar58._24_4_ = fVar95 * (float)uStack_c8;
        auVar58._28_4_ = uStack_c8._4_4_;
        auVar9 = vfmadd231ps_fma(auVar58,auVar22,local_6c0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar129,local_c0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar144,local_a0);
        auVar84._4_4_ = fVar148 * fVar148;
        auVar84._0_4_ = fVar149 * fVar149;
        auVar84._8_4_ = fVar130 * fVar130;
        auVar84._12_4_ = fVar131 * fVar131;
        auVar84._16_4_ = fVar132 * fVar132;
        auVar84._20_4_ = fVar133 * fVar133;
        auVar84._24_4_ = fVar134 * fVar134;
        auVar84._28_4_ = local_580._28_4_;
        auVar10 = vfmadd231ps_fma(auVar84,auVar117,auVar117);
        local_520 = ZEXT1632(auVar9);
        auVar199 = vmaxps_avx(ZEXT1632(auVar6),local_520);
        auVar205._0_4_ = auVar199._0_4_ * auVar199._0_4_ * auVar10._0_4_;
        auVar205._4_4_ = auVar199._4_4_ * auVar199._4_4_ * auVar10._4_4_;
        auVar205._8_4_ = auVar199._8_4_ * auVar199._8_4_ * auVar10._8_4_;
        auVar205._12_4_ = auVar199._12_4_ * auVar199._12_4_ * auVar10._12_4_;
        auVar205._16_4_ = auVar199._16_4_ * auVar199._16_4_ * 0.0;
        auVar205._20_4_ = auVar199._20_4_ * auVar199._20_4_ * 0.0;
        auVar205._24_4_ = auVar199._24_4_ * auVar199._24_4_ * 0.0;
        auVar205._28_4_ = 0;
        auVar59._4_4_ = auVar128._4_4_ * auVar128._4_4_;
        auVar59._0_4_ = auVar128._0_4_ * auVar128._0_4_;
        auVar59._8_4_ = auVar128._8_4_ * auVar128._8_4_;
        auVar59._12_4_ = auVar128._12_4_ * auVar128._12_4_;
        auVar59._16_4_ = auVar128._16_4_ * auVar128._16_4_;
        auVar59._20_4_ = auVar128._20_4_ * auVar128._20_4_;
        auVar59._24_4_ = auVar128._24_4_ * auVar128._24_4_;
        auVar59._28_4_ = auVar128._28_4_;
        auVar199 = vcmpps_avx(auVar59,auVar205,2);
        local_300 = (int)lVar112;
        auVar206._4_4_ = local_300;
        auVar206._0_4_ = local_300;
        auVar206._8_4_ = local_300;
        auVar206._12_4_ = local_300;
        auVar206._16_4_ = local_300;
        auVar206._20_4_ = local_300;
        auVar206._24_4_ = local_300;
        auVar206._28_4_ = local_300;
        auVar128 = vpor_avx2(auVar206,_DAT_01fb4ba0);
        auVar25 = vpcmpgtd_avx2(local_400,auVar128);
        auVar128 = auVar25 & auVar199;
        if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar128 >> 0x7f,0) == '\0') &&
              (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar128 >> 0xbf,0) == '\0') &&
            (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar128[0x1f]) {
          auVar215 = ZEXT3264(auVar214);
          auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,CONCAT416(
                                                  fVar190,CONCAT412(fVar195,CONCAT48(fVar190,uVar115
                                                                                    )))))));
          auVar194 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar147,CONCAT420(fVar147,CONCAT416(
                                                  fVar147,CONCAT412(fVar147,CONCAT48(fVar147,
                                                  CONCAT44(fVar147,fVar147))))))));
        }
        else {
          local_420 = vandps_avx(auVar25,auVar199);
          auVar60._4_4_ = local_6e0._4_4_ * fVar90;
          auVar60._0_4_ = (float)local_6e0 * fVar89;
          auVar60._8_4_ = (float)uStack_6d8 * fVar91;
          auVar60._12_4_ = uStack_6d8._4_4_ * fVar92;
          auVar60._16_4_ = (float)uStack_6d0 * fVar93;
          auVar60._20_4_ = uStack_6d0._4_4_ * fVar94;
          auVar60._24_4_ = (float)uStack_6c8 * fVar95;
          auVar60._28_4_ = auVar199._28_4_;
          auVar9 = vfmadd213ps_fma(auVar22,local_500,auVar60);
          auVar9 = vfmadd213ps_fma(auVar129,local_5c0,ZEXT1632(auVar9));
          auVar9 = vfmadd132ps_fma(auVar144,ZEXT1632(auVar9),local_680);
          local_600._0_4_ = auVar102._0_4_;
          local_600._4_4_ = auVar102._4_4_;
          fStack_5f8 = auVar102._8_4_;
          fStack_5f4 = auVar102._12_4_;
          fStack_5f0 = auVar102._16_4_;
          fStack_5ec = auVar102._20_4_;
          fStack_5e8 = auVar102._24_4_;
          auVar61._4_4_ = local_6e0._4_4_ * (float)local_600._4_4_;
          auVar61._0_4_ = (float)local_6e0 * (float)local_600._0_4_;
          auVar61._8_4_ = (float)uStack_6d8 * fStack_5f8;
          auVar61._12_4_ = uStack_6d8._4_4_ * fStack_5f4;
          auVar61._16_4_ = (float)uStack_6d0 * fStack_5f0;
          auVar61._20_4_ = uStack_6d0._4_4_ * fStack_5ec;
          auVar61._24_4_ = (float)uStack_6c8 * fStack_5e8;
          auVar61._28_4_ = auVar199._28_4_;
          auVar10 = vfmadd213ps_fma(auVar126,local_500,auVar61);
          auVar10 = vfmadd213ps_fma(auVar24,local_5c0,ZEXT1632(auVar10));
          auVar24 = *(undefined1 (*) [32])(lVar111 + 0x21fc4f4 + lVar112 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar111 + 0x21fc978 + lVar112 * 4);
          auVar144 = *(undefined1 (*) [32])(lVar111 + 0x21fcdfc + lVar112 * 4);
          pfVar1 = (float *)(lVar111 + 0x21fd280 + lVar112 * 4);
          fVar149 = *pfVar1;
          fVar148 = pfVar1[1];
          fVar130 = pfVar1[2];
          fVar131 = pfVar1[3];
          fVar132 = pfVar1[4];
          fVar133 = pfVar1[5];
          fVar134 = pfVar1[6];
          auVar200._0_4_ = fVar149 * fVar147;
          auVar200._4_4_ = fVar148 * fVar147;
          auVar200._8_4_ = fVar130 * fVar147;
          auVar200._12_4_ = fVar131 * fVar147;
          auVar200._16_4_ = fVar132 * fVar147;
          auVar200._20_4_ = fVar133 * fVar147;
          auVar200._24_4_ = fVar134 * fVar147;
          auVar200._28_4_ = 0;
          auVar217._0_4_ = fVar149 * fVar190;
          auVar217._4_4_ = fVar148 * fVar195;
          auVar217._8_4_ = fVar130 * fVar190;
          auVar217._12_4_ = fVar131 * fVar195;
          auVar217._16_4_ = fVar132 * fVar190;
          auVar217._20_4_ = fVar133 * fVar195;
          auVar217._24_4_ = fVar134 * fVar190;
          auVar217._28_4_ = 0;
          auVar62._4_4_ = fVar148 * local_6e0._4_4_;
          auVar62._0_4_ = fVar149 * (float)local_6e0;
          auVar62._8_4_ = fVar130 * (float)uStack_6d8;
          auVar62._12_4_ = fVar131 * uStack_6d8._4_4_;
          auVar62._16_4_ = fVar132 * (float)uStack_6d0;
          auVar62._20_4_ = fVar133 * uStack_6d0._4_4_;
          auVar62._24_4_ = fVar134 * (float)uStack_6c8;
          auVar62._28_4_ = pfVar1[7];
          auVar12 = vfmadd231ps_fma(auVar200,auVar144,auVar139);
          auVar13 = vfmadd231ps_fma(auVar217,auVar144,auVar204);
          auVar14 = vfmadd231ps_fma(auVar62,local_500,auVar144);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,auVar212);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar126,local_580);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_5c0,auVar126);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar24,auVar193);
          auVar100._8_8_ = uStack_598;
          auVar100._0_8_ = local_5a0;
          auVar100._16_8_ = uStack_590;
          auVar100._24_8_ = uStack_588;
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar24,auVar100);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar24,local_680);
          pfVar1 = (float *)(lVar111 + 0x21ff6a0 + lVar112 * 4);
          fVar149 = *pfVar1;
          fVar148 = pfVar1[1];
          fVar130 = pfVar1[2];
          fVar131 = pfVar1[3];
          fVar132 = pfVar1[4];
          fVar133 = pfVar1[5];
          fVar134 = pfVar1[6];
          auVar63._4_4_ = fVar147 * fVar148;
          auVar63._0_4_ = fVar147 * fVar149;
          auVar63._8_4_ = fVar147 * fVar130;
          auVar63._12_4_ = fVar147 * fVar131;
          auVar63._16_4_ = fVar147 * fVar132;
          auVar63._20_4_ = fVar147 * fVar133;
          auVar63._24_4_ = fVar147 * fVar134;
          auVar63._28_4_ = auVar117._28_4_;
          auVar64._4_4_ = fVar195 * fVar148;
          auVar64._0_4_ = fVar190 * fVar149;
          auVar64._8_4_ = fVar190 * fVar130;
          auVar64._12_4_ = fVar195 * fVar131;
          auVar64._16_4_ = fVar190 * fVar132;
          auVar64._20_4_ = fVar195 * fVar133;
          auVar64._24_4_ = fVar190 * fVar134;
          auVar64._28_4_ = auVar119._28_4_;
          auVar65._4_4_ = fVar148 * local_6e0._4_4_;
          auVar65._0_4_ = fVar149 * (float)local_6e0;
          auVar65._8_4_ = fVar130 * (float)uStack_6d8;
          auVar65._12_4_ = fVar131 * uStack_6d8._4_4_;
          auVar65._16_4_ = fVar132 * (float)uStack_6d0;
          auVar65._20_4_ = fVar133 * uStack_6d0._4_4_;
          auVar65._24_4_ = fVar134 * (float)uStack_6c8;
          auVar65._28_4_ = pfVar1[7];
          auVar24 = *(undefined1 (*) [32])(lVar111 + 0x21ff21c + lVar112 * 4);
          auVar180 = vfmadd231ps_fma(auVar63,auVar24,auVar139);
          auVar116 = vfmadd231ps_fma(auVar64,auVar24,auVar204);
          auVar136 = vfmadd231ps_fma(auVar65,local_500,auVar24);
          auVar24 = *(undefined1 (*) [32])(lVar111 + 0x21fed98 + lVar112 * 4);
          auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar24,auVar212);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar24,local_580);
          auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar24,local_5c0);
          auVar24 = *(undefined1 (*) [32])(lVar111 + 0x21fe914 + lVar112 * 4);
          auVar180 = vfmadd231ps_fma(ZEXT1632(auVar180),auVar24,auVar193);
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar24,auVar100);
          auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),local_680,auVar24);
          auVar24 = vandps_avx(ZEXT1632(auVar12),local_3c0);
          auVar126 = vandps_avx(ZEXT1632(auVar13),local_3c0);
          auVar126 = vmaxps_avx(auVar24,auVar126);
          auVar24 = vandps_avx(ZEXT1632(auVar14),local_3c0);
          auVar24 = vmaxps_avx(auVar126,auVar24);
          auVar24 = vcmpps_avx(auVar24,_local_440,1);
          auVar144 = vblendvps_avx(ZEXT1632(auVar12),auVar117,auVar24);
          auVar129 = vblendvps_avx(ZEXT1632(auVar13),auVar119,auVar24);
          auVar24 = vandps_avx(ZEXT1632(auVar180),local_3c0);
          auVar126 = vandps_avx(ZEXT1632(auVar116),local_3c0);
          auVar126 = vmaxps_avx(auVar24,auVar126);
          auVar24 = vandps_avx(local_3c0,ZEXT1632(auVar136));
          auVar24 = vmaxps_avx(auVar126,auVar24);
          auVar126 = vcmpps_avx(auVar24,_local_440,1);
          auVar24 = vblendvps_avx(ZEXT1632(auVar180),auVar117,auVar126);
          auVar126 = vblendvps_avx(ZEXT1632(auVar116),auVar119,auVar126);
          auVar10 = vfmadd213ps_fma(auVar118,local_680,ZEXT1632(auVar10));
          auVar12 = vfmadd213ps_fma(auVar144,auVar144,ZEXT832(0) << 0x20);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar129,auVar129);
          auVar118 = vrsqrtps_avx(ZEXT1632(auVar12));
          fVar149 = auVar118._0_4_;
          fVar148 = auVar118._4_4_;
          fVar130 = auVar118._8_4_;
          fVar131 = auVar118._12_4_;
          fVar132 = auVar118._16_4_;
          fVar133 = auVar118._20_4_;
          fVar134 = auVar118._24_4_;
          auVar66._4_4_ = fVar148 * fVar148 * fVar148 * auVar12._4_4_ * -0.5;
          auVar66._0_4_ = fVar149 * fVar149 * fVar149 * auVar12._0_4_ * -0.5;
          auVar66._8_4_ = fVar130 * fVar130 * fVar130 * auVar12._8_4_ * -0.5;
          auVar66._12_4_ = fVar131 * fVar131 * fVar131 * auVar12._12_4_ * -0.5;
          auVar66._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
          auVar66._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
          auVar66._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
          auVar66._28_4_ = 0;
          auVar227._8_4_ = 0x3fc00000;
          auVar227._0_8_ = 0x3fc000003fc00000;
          auVar227._12_4_ = 0x3fc00000;
          auVar227._16_4_ = 0x3fc00000;
          auVar227._20_4_ = 0x3fc00000;
          auVar227._24_4_ = 0x3fc00000;
          auVar227._28_4_ = 0x3fc00000;
          auVar12 = vfmadd231ps_fma(auVar66,auVar227,auVar118);
          fVar149 = auVar12._0_4_;
          fVar148 = auVar12._4_4_;
          auVar67._4_4_ = auVar129._4_4_ * fVar148;
          auVar67._0_4_ = auVar129._0_4_ * fVar149;
          fVar130 = auVar12._8_4_;
          auVar67._8_4_ = auVar129._8_4_ * fVar130;
          fVar131 = auVar12._12_4_;
          auVar67._12_4_ = auVar129._12_4_ * fVar131;
          auVar67._16_4_ = auVar129._16_4_ * 0.0;
          auVar67._20_4_ = auVar129._20_4_ * 0.0;
          auVar67._24_4_ = auVar129._24_4_ * 0.0;
          auVar67._28_4_ = auVar129._28_4_;
          auVar68._4_4_ = fVar148 * -auVar144._4_4_;
          auVar68._0_4_ = fVar149 * -auVar144._0_4_;
          auVar68._8_4_ = fVar130 * -auVar144._8_4_;
          auVar68._12_4_ = fVar131 * -auVar144._12_4_;
          auVar68._16_4_ = -auVar144._16_4_ * 0.0;
          auVar68._20_4_ = -auVar144._20_4_ * 0.0;
          auVar68._24_4_ = -auVar144._24_4_ * 0.0;
          auVar68._28_4_ = auVar118._28_4_;
          auVar12 = vfmadd213ps_fma(auVar24,auVar24,ZEXT832(0) << 0x20);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar126,auVar126);
          auVar118 = vrsqrtps_avx(ZEXT1632(auVar12));
          auVar69._28_4_ = auVar119._28_4_;
          auVar69._0_28_ =
               ZEXT1628(CONCAT412(fVar131 * 0.0,
                                  CONCAT48(fVar130 * 0.0,CONCAT44(fVar148 * 0.0,fVar149 * 0.0))));
          fVar149 = auVar118._0_4_;
          fVar148 = auVar118._4_4_;
          fVar130 = auVar118._8_4_;
          fVar131 = auVar118._12_4_;
          fVar132 = auVar118._16_4_;
          fVar133 = auVar118._20_4_;
          fVar134 = auVar118._24_4_;
          auVar70._4_4_ = fVar148 * fVar148 * fVar148 * auVar12._4_4_ * -0.5;
          auVar70._0_4_ = fVar149 * fVar149 * fVar149 * auVar12._0_4_ * -0.5;
          auVar70._8_4_ = fVar130 * fVar130 * fVar130 * auVar12._8_4_ * -0.5;
          auVar70._12_4_ = fVar131 * fVar131 * fVar131 * auVar12._12_4_ * -0.5;
          auVar70._16_4_ = fVar132 * fVar132 * fVar132 * -0.0;
          auVar70._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
          auVar70._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
          auVar70._28_4_ = 0;
          auVar12 = vfmadd231ps_fma(auVar70,auVar227,auVar118);
          fVar149 = auVar12._0_4_;
          fVar148 = auVar12._4_4_;
          auVar71._4_4_ = auVar126._4_4_ * fVar148;
          auVar71._0_4_ = auVar126._0_4_ * fVar149;
          fVar130 = auVar12._8_4_;
          auVar71._8_4_ = auVar126._8_4_ * fVar130;
          fVar131 = auVar12._12_4_;
          auVar71._12_4_ = auVar126._12_4_ * fVar131;
          auVar71._16_4_ = auVar126._16_4_ * 0.0;
          auVar71._20_4_ = auVar126._20_4_ * 0.0;
          auVar71._24_4_ = auVar126._24_4_ * 0.0;
          auVar71._28_4_ = 0;
          auVar72._4_4_ = fVar148 * -auVar24._4_4_;
          auVar72._0_4_ = fVar149 * -auVar24._0_4_;
          auVar72._8_4_ = fVar130 * -auVar24._8_4_;
          auVar72._12_4_ = fVar131 * -auVar24._12_4_;
          auVar72._16_4_ = -auVar24._16_4_ * 0.0;
          auVar72._20_4_ = -auVar24._20_4_ * 0.0;
          auVar72._24_4_ = -auVar24._24_4_ * 0.0;
          auVar72._28_4_ = auVar118._28_4_;
          auVar73._28_4_ = 0xbf000000;
          auVar73._0_28_ =
               ZEXT1628(CONCAT412(fVar131 * 0.0,
                                  CONCAT48(fVar130 * 0.0,CONCAT44(fVar148 * 0.0,fVar149 * 0.0))));
          auVar12 = vfmadd213ps_fma(auVar67,ZEXT1632(auVar6),local_6a0);
          auVar118 = ZEXT1632(auVar6);
          auVar13 = vfmadd213ps_fma(auVar68,auVar118,local_720);
          auVar14 = vfmadd213ps_fma(auVar69,auVar118,ZEXT1632(auVar10));
          auVar136 = vfnmadd213ps_fma(auVar67,auVar118,local_6a0);
          auVar180 = vfmadd213ps_fma(auVar71,local_520,ZEXT1632(auVar8));
          auVar137 = vfnmadd213ps_fma(auVar68,auVar118,local_720);
          auVar116 = vfmadd213ps_fma(auVar72,local_520,local_5e0);
          auVar173 = ZEXT1632(auVar6);
          auVar6 = vfnmadd231ps_fma(ZEXT1632(auVar10),auVar173,auVar69);
          auVar10 = vfmadd213ps_fma(auVar73,local_520,ZEXT1632(auVar9));
          auVar150 = vfnmadd213ps_fma(auVar71,local_520,ZEXT1632(auVar8));
          auVar164 = vfnmadd213ps_fma(auVar72,local_520,local_5e0);
          auVar165 = vfnmadd231ps_fma(ZEXT1632(auVar9),local_520,auVar73);
          auVar118 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar137));
          auVar24 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar6));
          auVar187._0_4_ = auVar118._0_4_ * auVar6._0_4_;
          auVar187._4_4_ = auVar118._4_4_ * auVar6._4_4_;
          auVar187._8_4_ = auVar118._8_4_ * auVar6._8_4_;
          auVar187._12_4_ = auVar118._12_4_ * auVar6._12_4_;
          auVar187._16_4_ = auVar118._16_4_ * 0.0;
          auVar187._20_4_ = auVar118._20_4_ * 0.0;
          auVar187._24_4_ = auVar118._24_4_ * 0.0;
          auVar187._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar187,ZEXT1632(auVar137),auVar24);
          auVar74._4_4_ = auVar136._4_4_ * auVar24._4_4_;
          auVar74._0_4_ = auVar136._0_4_ * auVar24._0_4_;
          auVar74._8_4_ = auVar136._8_4_ * auVar24._8_4_;
          auVar74._12_4_ = auVar136._12_4_ * auVar24._12_4_;
          auVar74._16_4_ = auVar24._16_4_ * 0.0;
          auVar74._20_4_ = auVar24._20_4_ * 0.0;
          auVar74._24_4_ = auVar24._24_4_ * 0.0;
          auVar74._28_4_ = auVar24._28_4_;
          auVar199 = ZEXT1632(auVar136);
          auVar24 = vsubps_avx(ZEXT1632(auVar180),auVar199);
          auVar128 = ZEXT1632(auVar6);
          auVar6 = vfmsub231ps_fma(auVar74,auVar128,auVar24);
          auVar75._4_4_ = auVar137._4_4_ * auVar24._4_4_;
          auVar75._0_4_ = auVar137._0_4_ * auVar24._0_4_;
          auVar75._8_4_ = auVar137._8_4_ * auVar24._8_4_;
          auVar75._12_4_ = auVar137._12_4_ * auVar24._12_4_;
          auVar75._16_4_ = auVar24._16_4_ * 0.0;
          auVar75._20_4_ = auVar24._20_4_ * 0.0;
          auVar75._24_4_ = auVar24._24_4_ * 0.0;
          auVar75._28_4_ = auVar24._28_4_;
          auVar9 = vfmsub231ps_fma(auVar75,auVar199,auVar118);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
          auVar25 = vcmpps_avx(ZEXT1632(auVar6),ZEXT832(0) << 0x20,2);
          auVar118 = vblendvps_avx(ZEXT1632(auVar150),ZEXT1632(auVar12),auVar25);
          auVar24 = vblendvps_avx(ZEXT1632(auVar164),ZEXT1632(auVar13),auVar25);
          auVar126 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar14),auVar25);
          auVar144 = vblendvps_avx(auVar199,ZEXT1632(auVar180),auVar25);
          auVar129 = vblendvps_avx(ZEXT1632(auVar137),ZEXT1632(auVar116),auVar25);
          auVar22 = vblendvps_avx(auVar128,ZEXT1632(auVar10),auVar25);
          auVar199 = vblendvps_avx(ZEXT1632(auVar180),auVar199,auVar25);
          auVar117 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar137),auVar25);
          auVar6 = vpackssdw_avx(local_420._0_16_,local_420._16_16_);
          auVar128 = vblendvps_avx(ZEXT1632(auVar10),auVar128,auVar25);
          auVar199 = vsubps_avx(auVar199,auVar118);
          auVar117 = vsubps_avx(auVar117,auVar24);
          auVar23 = vsubps_avx(auVar128,auVar126);
          auVar138 = vsubps_avx(auVar118,auVar144);
          auVar156 = vsubps_avx(auVar24,auVar129);
          auVar172 = vsubps_avx(auVar126,auVar22);
          auVar177._0_4_ = auVar23._0_4_ * auVar118._0_4_;
          auVar177._4_4_ = auVar23._4_4_ * auVar118._4_4_;
          auVar177._8_4_ = auVar23._8_4_ * auVar118._8_4_;
          auVar177._12_4_ = auVar23._12_4_ * auVar118._12_4_;
          auVar177._16_4_ = auVar23._16_4_ * auVar118._16_4_;
          auVar177._20_4_ = auVar23._20_4_ * auVar118._20_4_;
          auVar177._24_4_ = auVar23._24_4_ * auVar118._24_4_;
          auVar177._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar177,auVar126,auVar199);
          auVar76._4_4_ = auVar199._4_4_ * auVar24._4_4_;
          auVar76._0_4_ = auVar199._0_4_ * auVar24._0_4_;
          auVar76._8_4_ = auVar199._8_4_ * auVar24._8_4_;
          auVar76._12_4_ = auVar199._12_4_ * auVar24._12_4_;
          auVar76._16_4_ = auVar199._16_4_ * auVar24._16_4_;
          auVar76._20_4_ = auVar199._20_4_ * auVar24._20_4_;
          auVar76._24_4_ = auVar199._24_4_ * auVar24._24_4_;
          auVar76._28_4_ = auVar128._28_4_;
          auVar9 = vfmsub231ps_fma(auVar76,auVar118,auVar117);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
          auVar178._0_4_ = auVar117._0_4_ * auVar126._0_4_;
          auVar178._4_4_ = auVar117._4_4_ * auVar126._4_4_;
          auVar178._8_4_ = auVar117._8_4_ * auVar126._8_4_;
          auVar178._12_4_ = auVar117._12_4_ * auVar126._12_4_;
          auVar178._16_4_ = auVar117._16_4_ * auVar126._16_4_;
          auVar178._20_4_ = auVar117._20_4_ * auVar126._20_4_;
          auVar178._24_4_ = auVar117._24_4_ * auVar126._24_4_;
          auVar178._28_4_ = 0;
          auVar9 = vfmsub231ps_fma(auVar178,auVar24,auVar23);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
          auVar163 = ZEXT1664(auVar9);
          auVar179._0_4_ = auVar172._0_4_ * auVar144._0_4_;
          auVar179._4_4_ = auVar172._4_4_ * auVar144._4_4_;
          auVar179._8_4_ = auVar172._8_4_ * auVar144._8_4_;
          auVar179._12_4_ = auVar172._12_4_ * auVar144._12_4_;
          auVar179._16_4_ = auVar172._16_4_ * auVar144._16_4_;
          auVar179._20_4_ = auVar172._20_4_ * auVar144._20_4_;
          auVar179._24_4_ = auVar172._24_4_ * auVar144._24_4_;
          auVar179._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar179,auVar138,auVar22);
          auVar77._4_4_ = auVar156._4_4_ * auVar22._4_4_;
          auVar77._0_4_ = auVar156._0_4_ * auVar22._0_4_;
          auVar77._8_4_ = auVar156._8_4_ * auVar22._8_4_;
          auVar77._12_4_ = auVar156._12_4_ * auVar22._12_4_;
          auVar77._16_4_ = auVar156._16_4_ * auVar22._16_4_;
          auVar77._20_4_ = auVar156._20_4_ * auVar22._20_4_;
          auVar77._24_4_ = auVar156._24_4_ * auVar22._24_4_;
          auVar77._28_4_ = auVar22._28_4_;
          auVar10 = vfmsub231ps_fma(auVar77,auVar129,auVar172);
          auVar78._4_4_ = auVar138._4_4_ * auVar129._4_4_;
          auVar78._0_4_ = auVar138._0_4_ * auVar129._0_4_;
          auVar78._8_4_ = auVar138._8_4_ * auVar129._8_4_;
          auVar78._12_4_ = auVar138._12_4_ * auVar129._12_4_;
          auVar78._16_4_ = auVar138._16_4_ * auVar129._16_4_;
          auVar78._20_4_ = auVar138._20_4_ * auVar129._20_4_;
          auVar78._24_4_ = auVar138._24_4_ * auVar129._24_4_;
          auVar78._28_4_ = auVar129._28_4_;
          auVar12 = vfmsub231ps_fma(auVar78,auVar156,auVar144);
          auVar129 = ZEXT832(0) << 0x20;
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar129,ZEXT1632(auVar8));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar129,ZEXT1632(auVar10));
          auVar144 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
          auVar144 = vcmpps_avx(auVar144,auVar129,2);
          auVar8 = vpackssdw_avx(auVar144._0_16_,auVar144._16_16_);
          auVar6 = vpand_avx(auVar8,auVar6);
          auVar144 = vpmovsxwd_avx2(auVar6);
          if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar144 >> 0x7f,0) == '\0') &&
                (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar144 >> 0xbf,0) == '\0') &&
              (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar144[0x1f]) {
LAB_0143d090:
            auVar168._8_8_ = uStack_618;
            auVar168._0_8_ = local_620;
            auVar168._16_8_ = uStack_610;
            auVar168._24_8_ = uStack_608;
            auVar210 = ZEXT3264(auVar210._0_32_);
            auVar215 = ZEXT3264(auVar214);
          }
          else {
            auVar79._4_4_ = auVar117._4_4_ * auVar172._4_4_;
            auVar79._0_4_ = auVar117._0_4_ * auVar172._0_4_;
            auVar79._8_4_ = auVar117._8_4_ * auVar172._8_4_;
            auVar79._12_4_ = auVar117._12_4_ * auVar172._12_4_;
            auVar79._16_4_ = auVar117._16_4_ * auVar172._16_4_;
            auVar79._20_4_ = auVar117._20_4_ * auVar172._20_4_;
            auVar79._24_4_ = auVar117._24_4_ * auVar172._24_4_;
            auVar79._28_4_ = auVar144._28_4_;
            auVar14 = vfmsub231ps_fma(auVar79,auVar156,auVar23);
            auVar188._0_4_ = auVar23._0_4_ * auVar138._0_4_;
            auVar188._4_4_ = auVar23._4_4_ * auVar138._4_4_;
            auVar188._8_4_ = auVar23._8_4_ * auVar138._8_4_;
            auVar188._12_4_ = auVar23._12_4_ * auVar138._12_4_;
            auVar188._16_4_ = auVar23._16_4_ * auVar138._16_4_;
            auVar188._20_4_ = auVar23._20_4_ * auVar138._20_4_;
            auVar188._24_4_ = auVar23._24_4_ * auVar138._24_4_;
            auVar188._28_4_ = 0;
            auVar13 = vfmsub231ps_fma(auVar188,auVar199,auVar172);
            auVar80._4_4_ = auVar199._4_4_ * auVar156._4_4_;
            auVar80._0_4_ = auVar199._0_4_ * auVar156._0_4_;
            auVar80._8_4_ = auVar199._8_4_ * auVar156._8_4_;
            auVar80._12_4_ = auVar199._12_4_ * auVar156._12_4_;
            auVar80._16_4_ = auVar199._16_4_ * auVar156._16_4_;
            auVar80._20_4_ = auVar199._20_4_ * auVar156._20_4_;
            auVar80._24_4_ = auVar199._24_4_ * auVar156._24_4_;
            auVar80._28_4_ = auVar156._28_4_;
            auVar180 = vfmsub231ps_fma(auVar80,auVar138,auVar117);
            auVar8 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar13),ZEXT1632(auVar180));
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar14),auVar129);
            auVar144 = vrcpps_avx(ZEXT1632(auVar12));
            auVar218._8_4_ = 0x3f800000;
            auVar218._0_8_ = 0x3f8000003f800000;
            auVar218._12_4_ = 0x3f800000;
            auVar218._16_4_ = 0x3f800000;
            auVar218._20_4_ = 0x3f800000;
            auVar218._24_4_ = 0x3f800000;
            auVar218._28_4_ = 0x3f800000;
            auVar8 = vfnmadd213ps_fma(auVar144,ZEXT1632(auVar12),auVar218);
            auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar144,auVar144);
            auVar81._4_4_ = auVar180._4_4_ * auVar126._4_4_;
            auVar81._0_4_ = auVar180._0_4_ * auVar126._0_4_;
            auVar81._8_4_ = auVar180._8_4_ * auVar126._8_4_;
            auVar81._12_4_ = auVar180._12_4_ * auVar126._12_4_;
            auVar81._16_4_ = auVar126._16_4_ * 0.0;
            auVar81._20_4_ = auVar126._20_4_ * 0.0;
            auVar81._24_4_ = auVar126._24_4_ * 0.0;
            auVar81._28_4_ = auVar126._28_4_;
            auVar13 = vfmadd231ps_fma(auVar81,auVar24,ZEXT1632(auVar13));
            auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar14),auVar118);
            fVar149 = auVar8._0_4_;
            fVar148 = auVar8._4_4_;
            fVar130 = auVar8._8_4_;
            fVar131 = auVar8._12_4_;
            auVar126 = ZEXT1632(CONCAT412(fVar131 * auVar13._12_4_,
                                          CONCAT48(fVar130 * auVar13._8_4_,
                                                   CONCAT44(fVar148 * auVar13._4_4_,
                                                            fVar149 * auVar13._0_4_))));
            uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar167._4_4_ = uVar113;
            auVar167._0_4_ = uVar113;
            auVar167._8_4_ = uVar113;
            auVar167._12_4_ = uVar113;
            auVar167._16_4_ = uVar113;
            auVar167._20_4_ = uVar113;
            auVar167._24_4_ = uVar113;
            auVar167._28_4_ = uVar113;
            auVar101._4_4_ = fStack_45c;
            auVar101._0_4_ = local_460;
            auVar101._8_4_ = fStack_458;
            auVar101._12_4_ = fStack_454;
            auVar101._16_4_ = fStack_450;
            auVar101._20_4_ = fStack_44c;
            auVar101._24_4_ = fStack_448;
            auVar101._28_4_ = uStack_444;
            auVar118 = vcmpps_avx(auVar101,auVar126,2);
            auVar24 = vcmpps_avx(auVar126,auVar167,2);
            auVar118 = vandps_avx(auVar24,auVar118);
            auVar8 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
            auVar6 = vpand_avx(auVar6,auVar8);
            auVar118 = vpmovsxwd_avx2(auVar6);
            if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar118 >> 0x7f,0) == '\0') &&
                  (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0xbf,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar118[0x1f]) goto LAB_0143d090;
            auVar118 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,4);
            auVar8 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
            auVar6 = vpand_avx(auVar6,auVar8);
            auVar118 = vpmovsxwd_avx2(auVar6);
            auVar168._8_8_ = uStack_618;
            auVar168._0_8_ = local_620;
            auVar168._16_8_ = uStack_610;
            auVar168._24_8_ = uStack_608;
            auVar210 = ZEXT3264(auVar210._0_32_);
            auVar215 = ZEXT3264(auVar214);
            if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar118 >> 0x7f,0) != '\0') ||
                  (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar118 >> 0xbf,0) != '\0') ||
                (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar118[0x1f] < '\0') {
              auVar144 = ZEXT1632(CONCAT412(fVar131 * auVar9._12_4_,
                                            CONCAT48(fVar130 * auVar9._8_4_,
                                                     CONCAT44(fVar148 * auVar9._4_4_,
                                                              fVar149 * auVar9._0_4_))));
              auVar82._28_4_ = SUB84(uStack_608,4);
              auVar82._0_28_ =
                   ZEXT1628(CONCAT412(fVar131 * auVar10._12_4_,
                                      CONCAT48(fVar130 * auVar10._8_4_,
                                               CONCAT44(fVar148 * auVar10._4_4_,
                                                        fVar149 * auVar10._0_4_))));
              auVar201._8_4_ = 0x3f800000;
              auVar201._0_8_ = 0x3f8000003f800000;
              auVar201._12_4_ = 0x3f800000;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar24 = vsubps_avx(auVar201,auVar144);
              auVar24 = vblendvps_avx(auVar24,auVar144,auVar25);
              auVar210 = ZEXT3264(auVar24);
              auVar24 = vsubps_avx(auVar201,auVar82);
              local_4e0 = vblendvps_avx(auVar24,auVar82,auVar25);
              auVar163 = ZEXT3264(local_4e0);
              auVar215 = ZEXT3264(auVar126);
              auVar168 = auVar118;
            }
          }
          if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar168 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar168 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar168 >> 0x7f,0) == '\0') &&
                (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar168 >> 0xbf,0) == '\0') &&
              (auVar168 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar168[0x1f]) {
            auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,CONCAT416(
                                                  fVar190,CONCAT412(fVar195,CONCAT48(fVar190,uVar115
                                                                                    )))))));
            auVar194 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar147,CONCAT420(fVar147,CONCAT416(
                                                  fVar147,CONCAT412(fVar147,CONCAT48(fVar147,
                                                  CONCAT44(fVar147,fVar147))))))));
          }
          else {
            auVar118 = vsubps_avx(local_520,auVar173);
            auVar126 = auVar210._0_32_;
            auVar6 = vfmadd213ps_fma(auVar118,auVar126,auVar173);
            fVar149 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar83._4_4_ = (auVar6._4_4_ + auVar6._4_4_) * fVar149;
            auVar83._0_4_ = (auVar6._0_4_ + auVar6._0_4_) * fVar149;
            auVar83._8_4_ = (auVar6._8_4_ + auVar6._8_4_) * fVar149;
            auVar83._12_4_ = (auVar6._12_4_ + auVar6._12_4_) * fVar149;
            auVar83._16_4_ = fVar149 * 0.0;
            auVar83._20_4_ = fVar149 * 0.0;
            auVar83._24_4_ = fVar149 * 0.0;
            auVar83._28_4_ = fVar149;
            auVar144 = auVar215._0_32_;
            auVar118 = vcmpps_avx(auVar144,auVar83,6);
            auVar24 = auVar168 & auVar118;
            auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,CONCAT416(
                                                  fVar190,CONCAT412(fVar195,CONCAT48(fVar190,uVar115
                                                                                    )))))));
            auVar97._4_4_ = fVar147;
            auVar97._0_4_ = fVar147;
            auVar97._8_4_ = fVar147;
            auVar97._12_4_ = fVar147;
            auVar97._16_4_ = fVar147;
            auVar97._20_4_ = fVar147;
            auVar97._24_4_ = fVar147;
            auVar97._28_4_ = fVar147;
            auVar194 = ZEXT3264(auVar97);
            if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0x7f,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar24 >> 0xbf,0) != '\0') ||
                (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar24[0x1f] < '\0') {
              auVar146._8_4_ = 0xbf800000;
              auVar146._0_8_ = 0xbf800000bf800000;
              auVar146._12_4_ = 0xbf800000;
              auVar146._16_4_ = 0xbf800000;
              auVar146._20_4_ = 0xbf800000;
              auVar146._24_4_ = 0xbf800000;
              auVar146._28_4_ = 0xbf800000;
              auVar161._8_4_ = 0x40000000;
              auVar161._0_8_ = 0x4000000040000000;
              auVar161._12_4_ = 0x40000000;
              auVar161._16_4_ = 0x40000000;
              auVar161._20_4_ = 0x40000000;
              auVar161._24_4_ = 0x40000000;
              auVar161._28_4_ = 0x40000000;
              auVar163 = ZEXT3264(auVar161);
              auVar6 = vfmadd213ps_fma(local_4e0,auVar161,auVar146);
              local_340 = ZEXT1632(auVar6);
              local_2f0 = local_770;
              uStack_2e8 = uStack_768;
              local_2e0 = local_780;
              uStack_2d8 = uStack_778;
              local_2d0 = local_6f0._0_8_;
              uStack_2c8 = local_6f0._8_8_;
              pGVar17 = (context->scene->geometries).items[uVar16].ptr;
              local_4e0 = local_340;
              if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar106 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar106 = context->args;
                if ((pRVar106->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar106 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar106 >> 8),1),
                   pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_720 = ZEXT1632(CONCAT124(auVar7._4_12_,(int)uVar108));
                  auVar118 = vandps_avx(auVar118,auVar168);
                  fVar149 = (float)local_300;
                  auVar163 = ZEXT3264(CONCAT428(fVar149,CONCAT424(fVar149,CONCAT420(fVar149,
                                                  CONCAT416(fVar149,CONCAT412(fVar149,CONCAT48(
                                                  fVar149,CONCAT44(fVar149,fVar149))))))));
                  local_280[0] = (fVar149 + auVar210._0_4_ + 0.0) * local_540;
                  local_280[1] = (fVar149 + auVar210._4_4_ + 1.0) * fStack_53c;
                  local_280[2] = (fVar149 + auVar210._8_4_ + 2.0) * fStack_538;
                  local_280[3] = (fVar149 + auVar210._12_4_ + 3.0) * fStack_534;
                  fStack_270 = (fVar149 + auVar210._16_4_ + 4.0) * fStack_530;
                  fStack_26c = (fVar149 + auVar210._20_4_ + 5.0) * fStack_52c;
                  fStack_268 = (fVar149 + auVar210._24_4_ + 6.0) * fStack_528;
                  fStack_264 = fVar149 + auVar210._28_4_ + 7.0;
                  local_4e0._0_8_ = auVar6._0_8_;
                  local_4e0._8_8_ = auVar6._8_8_;
                  local_260 = local_4e0._0_8_;
                  uStack_258 = local_4e0._8_8_;
                  uStack_250 = 0;
                  uStack_248 = 0;
                  local_240 = auVar144;
                  uVar113 = vmovmskps_avx(auVar118);
                  uVar108 = 0;
                  uVar107 = CONCAT44((int)((ulong)pRVar106 >> 0x20),uVar113);
                  for (uVar26 = uVar107; (uVar26 & 1) == 0;
                      uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                    uVar108 = uVar108 + 1;
                  }
                  auVar118 = vpcmpeqd_avx2(auVar97,auVar97);
                  _local_600 = auVar119;
                  local_360 = auVar126;
                  local_320 = auVar144;
                  local_2fc = iVar104;
                  while (uVar107 != 0) {
                    uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_1c0 = local_280[uVar108];
                    local_1a0 = *(undefined4 *)((long)&local_260 + uVar108 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_240 + uVar108 * 4);
                    fVar130 = 1.0 - local_1c0;
                    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130)),
                                             ZEXT416((uint)(local_1c0 * fVar130)),
                                             ZEXT416(0xc0000000));
                    auVar6 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar130)),
                                             ZEXT416((uint)(local_1c0 * local_1c0)),
                                             ZEXT416(0x40000000));
                    fVar149 = auVar6._0_4_ * 3.0;
                    fVar148 = local_1c0 * local_1c0 * 3.0;
                    auVar176._0_4_ = fVar148 * (float)local_640._0_4_;
                    auVar176._4_4_ = fVar148 * (float)local_640._4_4_;
                    auVar176._8_4_ = fVar148 * fStack_638;
                    auVar176._12_4_ = fVar148 * fStack_634;
                    auVar153._4_4_ = fVar149;
                    auVar153._0_4_ = fVar149;
                    auVar153._8_4_ = fVar149;
                    auVar153._12_4_ = fVar149;
                    auVar6 = vfmadd132ps_fma(auVar153,auVar176,local_6f0);
                    fVar149 = auVar7._0_4_ * 3.0;
                    auVar171._4_4_ = fVar149;
                    auVar171._0_4_ = fVar149;
                    auVar171._8_4_ = fVar149;
                    auVar171._12_4_ = fVar149;
                    auVar6 = vfmadd132ps_fma(auVar171,auVar6,auVar228);
                    fVar149 = fVar130 * fVar130 * -3.0;
                    local_750.context = context->user;
                    auVar154._4_4_ = fVar149;
                    auVar154._0_4_ = fVar149;
                    auVar154._8_4_ = fVar149;
                    auVar154._12_4_ = fVar149;
                    auVar7 = vfmadd132ps_fma(auVar154,auVar6,auVar11);
                    local_220 = auVar7._0_4_;
                    uStack_21c = local_220;
                    uStack_218 = local_220;
                    uStack_214 = local_220;
                    uStack_210 = local_220;
                    uStack_20c = local_220;
                    uStack_208 = local_220;
                    uStack_204 = local_220;
                    auVar6 = vmovshdup_avx(auVar7);
                    local_200 = auVar6._0_8_;
                    uStack_1f8 = local_200;
                    uStack_1f0 = local_200;
                    uStack_1e8 = local_200;
                    auVar6 = vshufps_avx(auVar7,auVar7,0xaa);
                    auVar155._0_8_ = auVar6._0_8_;
                    auVar155._8_8_ = auVar155._0_8_;
                    local_1e0._16_8_ = auVar155._0_8_;
                    local_1e0._0_16_ = auVar155;
                    local_1e0._24_8_ = auVar155._0_8_;
                    auVar163 = ZEXT3264(local_1e0);
                    fStack_1bc = local_1c0;
                    fStack_1b8 = local_1c0;
                    fStack_1b4 = local_1c0;
                    fStack_1b0 = local_1c0;
                    fStack_1ac = local_1c0;
                    fStack_1a8 = local_1c0;
                    fStack_1a4 = local_1c0;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = CONCAT44(fStack_49c,local_4a0);
                    uStack_178 = CONCAT44(fStack_494,fStack_498);
                    uStack_170 = CONCAT44(fStack_48c,fStack_490);
                    uStack_168 = CONCAT44(uStack_484,fStack_488);
                    local_160 = local_480._0_8_;
                    uStack_158 = local_480._8_8_;
                    uStack_150 = local_480._16_8_;
                    uStack_148 = local_480._24_8_;
                    local_140 = (local_750.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_750.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_660 = local_3e0;
                    local_750.valid = (int *)local_660;
                    local_750.geometryUserPtr = pGVar17->userPtr;
                    local_750.hit = (RTCHitN *)&local_220;
                    local_750.N = 8;
                    local_750.ray = (RTCRayN *)ray;
                    if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar163 = ZEXT1664(auVar155);
                      auVar118 = ZEXT1632(auVar118._0_16_);
                      (*pGVar17->occlusionFilterN)(&local_750);
                    }
                    auVar129 = vpcmpeqd_avx2(local_660,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar118 = vpcmpeqd_avx2(auVar118,auVar118);
                    auVar24 = auVar118 & ~auVar129;
                    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar24 >> 0x7f,0) == '\0') &&
                          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar24 >> 0xbf,0) == '\0') &&
                        (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar24[0x1f]) {
                      auVar129 = auVar129 ^ auVar118;
                    }
                    else {
                      p_Var21 = context->args->filter;
                      if ((p_Var21 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar118 = ZEXT1632(auVar118._0_16_);
                        (*p_Var21)(&local_750);
                      }
                      auVar24 = vpcmpeqd_avx2(local_660,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      auVar118 = vpcmpeqd_avx2(auVar118,auVar118);
                      auVar129 = auVar24 ^ auVar118;
                      auVar162._8_4_ = 0xff800000;
                      auVar162._0_8_ = 0xff800000ff800000;
                      auVar162._12_4_ = 0xff800000;
                      auVar162._16_4_ = 0xff800000;
                      auVar162._20_4_ = 0xff800000;
                      auVar162._24_4_ = 0xff800000;
                      auVar162._28_4_ = 0xff800000;
                      auVar163 = ZEXT3264(auVar162);
                      auVar24 = vblendvps_avx(auVar162,*(undefined1 (*) [32])(local_750.ray + 0x100)
                                              ,auVar24);
                      *(undefined1 (*) [32])(local_750.ray + 0x100) = auVar24;
                    }
                    if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar129 >> 0x7f,0) != '\0') ||
                          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar129 >> 0xbf,0) != '\0') ||
                        (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar129[0x1f] < '\0') {
                      pRVar106 = (RTCIntersectArguments *)0x1;
                      goto LAB_0143d0c5;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar113;
                    uVar26 = uVar108 & 0x3f;
                    uVar108 = 0;
                    uVar107 = uVar107 ^ 1L << uVar26;
                    for (uVar26 = uVar107; (uVar26 & 1) == 0;
                        uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                      uVar108 = uVar108 + 1;
                    }
                  }
                  pRVar106 = (RTCIntersectArguments *)0x0;
LAB_0143d0c5:
                  auVar210 = ZEXT3264(auVar126);
                  auVar215 = ZEXT3264(auVar144);
                  auVar189 = ZEXT3264(CONCAT428(fVar195,CONCAT424(fVar190,CONCAT420(fVar195,
                                                  CONCAT416(fVar190,CONCAT412(fVar195,CONCAT48(
                                                  fVar190,uVar115)))))));
                  auVar194 = ZEXT3264(CONCAT428(fVar147,CONCAT424(fVar147,CONCAT420(fVar147,
                                                  CONCAT416(fVar147,CONCAT412(fVar147,CONCAT48(
                                                  fVar147,CONCAT44(fVar147,fVar147))))))));
                  uVar108 = (ulong)(uint)local_720._0_4_;
                }
              }
              uVar108 = CONCAT71((int7)(uVar108 >> 8),(byte)uVar108 | (byte)pRVar106);
            }
          }
        }
        auVar5._8_8_ = uStack_598;
        auVar5._0_8_ = local_5a0;
        auVar5._16_8_ = uStack_590;
        auVar5._24_8_ = uStack_588;
      }
    }
    if ((uVar108 & 1) != 0) break;
    uVar113 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar127._4_4_ = uVar113;
    auVar127._0_4_ = uVar113;
    auVar127._8_4_ = uVar113;
    auVar127._12_4_ = uVar113;
    auVar127._16_4_ = uVar113;
    auVar127._20_4_ = uVar113;
    auVar127._24_4_ = uVar113;
    auVar127._28_4_ = uVar113;
    auVar118 = vcmpps_avx(local_80,auVar127,2);
    uVar109 = vmovmskps_avx(auVar118);
  }
  return uVar105 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }